

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx2::CurveNvIntersector1<4>::
     intersect_t<embree::avx2::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  uint uVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  bool bVar78;
  bool bVar79;
  long lVar80;
  bool bVar81;
  bool bVar82;
  bool bVar83;
  bool bVar84;
  bool bVar85;
  bool bVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [28];
  uint uVar93;
  uint uVar94;
  ulong uVar95;
  uint uVar96;
  ulong uVar97;
  undefined1 auVar98 [8];
  Primitive *pPVar99;
  ulong uVar100;
  long lVar101;
  undefined4 uVar102;
  undefined8 uVar104;
  float fVar122;
  vint4 bi_2;
  undefined1 auVar105 [16];
  float fVar120;
  float fVar124;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar103;
  float fVar121;
  float fVar123;
  float fVar125;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar109 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar129;
  float fVar146;
  vint4 bi_1;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  float fVar147;
  float fVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar161;
  float fVar166;
  vint4 ai_2;
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  vint4 ai;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  vint4 bi;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  vint4 ai_1;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar210;
  undefined1 auVar208 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  undefined1 auVar204 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar209 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [64];
  undefined4 uVar216;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  float fVar229;
  float fVar230;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  Precalculations *local_748;
  RayHit *local_740;
  RayQueryContext *local_738;
  Primitive *local_730;
  ulong local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  undefined8 uStack_578;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined8 local_550;
  undefined4 local_548;
  float local_544;
  undefined4 local_540;
  uint local_53c;
  undefined4 local_538;
  uint local_534;
  uint local_530;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 auStack_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_460 [2] [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  int local_340;
  int local_33c;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2e0 [32];
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar165 [64];
  undefined1 auVar203 [16];
  
  PVar7 = prim[1];
  uVar100 = (ulong)(byte)PVar7;
  lVar80 = uVar100 * 0x19;
  fVar147 = *(float *)(prim + lVar80 + 0x12);
  auVar172 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar80 + 6));
  auVar105._0_4_ = fVar147 * auVar172._0_4_;
  auVar105._4_4_ = fVar147 * auVar172._4_4_;
  auVar105._8_4_ = fVar147 * auVar172._8_4_;
  auVar105._12_4_ = fVar147 * auVar172._12_4_;
  auVar181._0_4_ = fVar147 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar181._4_4_ = fVar147 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar181._8_4_ = fVar147 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar181._12_4_ = fVar147 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 4 + 6)));
  auVar172 = vcvtdq2ps_avx(auVar172);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 5 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 6 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0xb + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar7 * 0xc + uVar100 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  uVar95 = (ulong)(uint)((int)(uVar100 * 9) * 2);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 + uVar100 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  uVar95 = (ulong)(uint)((int)(uVar100 * 5) << 2);
  auVar149 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 + 6)));
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar226._4_4_ = auVar181._0_4_;
  auVar226._0_4_ = auVar181._0_4_;
  auVar226._8_4_ = auVar181._0_4_;
  auVar226._12_4_ = auVar181._0_4_;
  auVar131 = vshufps_avx(auVar181,auVar181,0x55);
  auVar106 = vshufps_avx(auVar181,auVar181,0xaa);
  fVar147 = auVar106._0_4_;
  auVar217._0_4_ = fVar147 * auVar13._0_4_;
  fVar120 = auVar106._4_4_;
  auVar217._4_4_ = fVar120 * auVar13._4_4_;
  fVar122 = auVar106._8_4_;
  auVar217._8_4_ = fVar122 * auVar13._8_4_;
  fVar124 = auVar106._12_4_;
  auVar217._12_4_ = fVar124 * auVar13._12_4_;
  auVar214._0_4_ = auVar16._0_4_ * fVar147;
  auVar214._4_4_ = auVar16._4_4_ * fVar120;
  auVar214._8_4_ = auVar16._8_4_ * fVar122;
  auVar214._12_4_ = auVar16._12_4_ * fVar124;
  auVar198._0_4_ = auVar149._0_4_ * fVar147;
  auVar198._4_4_ = auVar149._4_4_ * fVar120;
  auVar198._8_4_ = auVar149._8_4_ * fVar122;
  auVar198._12_4_ = auVar149._12_4_ * fVar124;
  auVar106 = vfmadd231ps_fma(auVar217,auVar131,auVar12);
  auVar132 = vfmadd231ps_fma(auVar214,auVar131,auVar15);
  auVar131 = vfmadd231ps_fma(auVar198,auVar107,auVar131);
  auVar162 = vfmadd231ps_fma(auVar106,auVar226,auVar172);
  auVar132 = vfmadd231ps_fma(auVar132,auVar226,auVar14);
  auVar215 = ZEXT1664(auVar132);
  auVar168 = vfmadd231ps_fma(auVar131,auVar108,auVar226);
  auVar227._4_4_ = auVar105._0_4_;
  auVar227._0_4_ = auVar105._0_4_;
  auVar227._8_4_ = auVar105._0_4_;
  auVar227._12_4_ = auVar105._0_4_;
  auVar131 = vshufps_avx(auVar105,auVar105,0x55);
  auVar106 = vshufps_avx(auVar105,auVar105,0xaa);
  fVar147 = auVar106._0_4_;
  auVar182._0_4_ = fVar147 * auVar13._0_4_;
  fVar120 = auVar106._4_4_;
  auVar182._4_4_ = fVar120 * auVar13._4_4_;
  fVar122 = auVar106._8_4_;
  auVar182._8_4_ = fVar122 * auVar13._8_4_;
  fVar124 = auVar106._12_4_;
  auVar182._12_4_ = fVar124 * auVar13._12_4_;
  auVar130._0_4_ = auVar16._0_4_ * fVar147;
  auVar130._4_4_ = auVar16._4_4_ * fVar120;
  auVar130._8_4_ = auVar16._8_4_ * fVar122;
  auVar130._12_4_ = auVar16._12_4_ * fVar124;
  auVar106._0_4_ = auVar149._0_4_ * fVar147;
  auVar106._4_4_ = auVar149._4_4_ * fVar120;
  auVar106._8_4_ = auVar149._8_4_ * fVar122;
  auVar106._12_4_ = auVar149._12_4_ * fVar124;
  auVar12 = vfmadd231ps_fma(auVar182,auVar131,auVar12);
  auVar13 = vfmadd231ps_fma(auVar130,auVar131,auVar15);
  auVar15 = vfmadd231ps_fma(auVar106,auVar131,auVar107);
  auVar16 = vfmadd231ps_fma(auVar12,auVar227,auVar172);
  auVar107 = vfmadd231ps_fma(auVar13,auVar227,auVar14);
  auVar149 = vfmadd231ps_fma(auVar15,auVar227,auVar108);
  local_170._8_4_ = 0x7fffffff;
  local_170._0_8_ = 0x7fffffff7fffffff;
  local_170._12_4_ = 0x7fffffff;
  auVar172 = vandps_avx(auVar162,local_170);
  auVar167._8_4_ = 0x219392ef;
  auVar167._0_8_ = 0x219392ef219392ef;
  auVar167._12_4_ = 0x219392ef;
  auVar172 = vcmpps_avx(auVar172,auVar167,1);
  auVar12 = vblendvps_avx(auVar162,auVar167,auVar172);
  auVar172 = vandps_avx(auVar132,local_170);
  auVar172 = vcmpps_avx(auVar172,auVar167,1);
  auVar13 = vblendvps_avx(auVar132,auVar167,auVar172);
  auVar172 = vandps_avx(auVar168,local_170);
  auVar172 = vcmpps_avx(auVar172,auVar167,1);
  auVar172 = vblendvps_avx(auVar168,auVar167,auVar172);
  auVar14 = vrcpps_avx(auVar12);
  auVar193._8_4_ = 0x3f800000;
  auVar193._0_8_ = &DAT_3f8000003f800000;
  auVar193._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar14,auVar193);
  auVar14 = vfmadd132ps_fma(auVar12,auVar14,auVar14);
  auVar12 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar12,auVar193);
  auVar15 = vfmadd132ps_fma(auVar13,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar172);
  auVar172 = vfnmadd213ps_fma(auVar172,auVar12,auVar193);
  auVar108 = vfmadd132ps_fma(auVar172,auVar12,auVar12);
  auVar172._8_8_ = 0;
  auVar172._0_8_ = *(ulong *)(prim + uVar100 * 7 + 6);
  auVar172 = vpmovsxwd_avx(auVar172);
  auVar172 = vcvtdq2ps_avx(auVar172);
  auVar172 = vsubps_avx(auVar172,auVar16);
  auVar168._0_4_ = auVar14._0_4_ * auVar172._0_4_;
  auVar168._4_4_ = auVar14._4_4_ * auVar172._4_4_;
  auVar168._8_4_ = auVar14._8_4_ * auVar172._8_4_;
  auVar168._12_4_ = auVar14._12_4_ * auVar172._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar100 * 9 + 6);
  auVar172 = vpmovsxwd_avx(auVar12);
  auVar172 = vcvtdq2ps_avx(auVar172);
  auVar172 = vsubps_avx(auVar172,auVar16);
  auVar183._0_4_ = auVar14._0_4_ * auVar172._0_4_;
  auVar183._4_4_ = auVar14._4_4_ * auVar172._4_4_;
  auVar183._8_4_ = auVar14._8_4_ * auVar172._8_4_;
  auVar183._12_4_ = auVar14._12_4_ * auVar172._12_4_;
  auVar132._1_3_ = 0;
  auVar132[0] = PVar7;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar100 * -2 + 6);
  auVar172 = vpmovsxwd_avx(auVar14);
  auVar172 = vcvtdq2ps_avx(auVar172);
  auVar172 = vsubps_avx(auVar172,auVar107);
  auVar199._0_4_ = auVar172._0_4_ * auVar15._0_4_;
  auVar199._4_4_ = auVar172._4_4_ * auVar15._4_4_;
  auVar199._8_4_ = auVar172._8_4_ * auVar15._8_4_;
  auVar199._12_4_ = auVar172._12_4_ * auVar15._12_4_;
  auVar172 = vcvtdq2ps_avx(auVar12);
  auVar172 = vsubps_avx(auVar172,auVar107);
  auVar131._0_4_ = auVar15._0_4_ * auVar172._0_4_;
  auVar131._4_4_ = auVar15._4_4_ * auVar172._4_4_;
  auVar131._8_4_ = auVar15._8_4_ * auVar172._8_4_;
  auVar131._12_4_ = auVar15._12_4_ * auVar172._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar95 + uVar100 + 6);
  auVar172 = vpmovsxwd_avx(auVar15);
  auVar172 = vcvtdq2ps_avx(auVar172);
  auVar172 = vsubps_avx(auVar172,auVar149);
  auVar162._0_4_ = auVar108._0_4_ * auVar172._0_4_;
  auVar162._4_4_ = auVar108._4_4_ * auVar172._4_4_;
  auVar162._8_4_ = auVar108._8_4_ * auVar172._8_4_;
  auVar162._12_4_ = auVar108._12_4_ * auVar172._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar100 * 0x17 + 6);
  auVar172 = vpmovsxwd_avx(auVar16);
  auVar172 = vcvtdq2ps_avx(auVar172);
  auVar172 = vsubps_avx(auVar172,auVar149);
  auVar107._0_4_ = auVar108._0_4_ * auVar172._0_4_;
  auVar107._4_4_ = auVar108._4_4_ * auVar172._4_4_;
  auVar107._8_4_ = auVar108._8_4_ * auVar172._8_4_;
  auVar107._12_4_ = auVar108._12_4_ * auVar172._12_4_;
  auVar172 = vpminsd_avx(auVar168,auVar183);
  auVar12 = vpminsd_avx(auVar199,auVar131);
  auVar172 = vmaxps_avx(auVar172,auVar12);
  auVar12 = vpminsd_avx(auVar162,auVar107);
  uVar102 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar203._4_4_ = uVar102;
  auVar203._0_4_ = uVar102;
  auVar203._8_4_ = uVar102;
  auVar203._12_4_ = uVar102;
  auVar209 = ZEXT1664(auVar203);
  auVar12 = vmaxps_avx(auVar12,auVar203);
  auVar172 = vmaxps_avx(auVar172,auVar12);
  local_180._0_4_ = auVar172._0_4_ * 0.99999964;
  local_180._4_4_ = auVar172._4_4_ * 0.99999964;
  local_180._8_4_ = auVar172._8_4_ * 0.99999964;
  local_180._12_4_ = auVar172._12_4_ * 0.99999964;
  auVar172 = vpmaxsd_avx(auVar168,auVar183);
  auVar12 = vpmaxsd_avx(auVar199,auVar131);
  auVar172 = vminps_avx(auVar172,auVar12);
  auVar12 = vpmaxsd_avx(auVar162,auVar107);
  fVar147 = (ray->super_RayK<1>).tfar;
  auVar149._4_4_ = fVar147;
  auVar149._0_4_ = fVar147;
  auVar149._8_4_ = fVar147;
  auVar149._12_4_ = fVar147;
  auVar12 = vminps_avx(auVar12,auVar149);
  auVar172 = vminps_avx(auVar172,auVar12);
  auVar108._0_4_ = auVar172._0_4_ * 1.0000004;
  auVar108._4_4_ = auVar172._4_4_ * 1.0000004;
  auVar108._8_4_ = auVar172._8_4_ * 1.0000004;
  auVar108._12_4_ = auVar172._12_4_ * 1.0000004;
  auVar132[4] = PVar7;
  auVar132._5_3_ = 0;
  auVar132[8] = PVar7;
  auVar132._9_3_ = 0;
  auVar132[0xc] = PVar7;
  auVar132._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar132,_DAT_01ff0cf0);
  auVar172 = vcmpps_avx(local_180,auVar108,2);
  auVar172 = vandps_avx(auVar172,auVar12);
  uVar96 = vmovmskps_avx(auVar172);
  if (uVar96 != 0) {
    uVar96 = uVar96 & 0xff;
    local_460[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_460[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_460[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_460[1]._24_8_ = mm_lookupmask_ps._24_8_;
    pPVar99 = prim;
    do {
      local_6a0 = auVar209._0_32_;
      local_660 = auVar215._0_32_;
      lVar22 = 0;
      uVar100 = (ulong)uVar96;
      for (uVar95 = uVar100; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar100 = uVar100 - 1 & uVar100;
      uVar96 = *(uint *)(pPVar99 + lVar22 * 4 + 6);
      uVar95 = (ulong)(uint)((int)lVar22 << 6);
      uVar8 = *(uint *)(pPVar99 + 2);
      local_728 = (ulong)uVar8;
      pGVar10 = (context->scene->geometries).items[uVar8].ptr;
      pPVar1 = prim + uVar95 + lVar80 + 0x16;
      local_6e0 = *(undefined8 *)pPVar1;
      uStack_6d8 = *(undefined8 *)(pPVar1 + 8);
      if (uVar100 != 0) {
        uVar97 = uVar100 - 1 & uVar100;
        for (uVar23 = uVar100; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
        }
        if (uVar97 != 0) {
          for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_560 = *(undefined1 (*) [16])(prim + uVar95 + lVar80 + 0x26);
      auVar132 = local_560;
      local_570 = *(undefined1 (*) [16])(prim + uVar95 + lVar80 + 0x36);
      _local_580 = *(undefined1 (*) [16])(prim + uVar95 + lVar80 + 0x46);
      iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar4 = (ray->super_RayK<1>).org.field_0;
      auVar12 = vsubps_avx(*(undefined1 (*) [16])pPVar1,(undefined1  [16])aVar4);
      uVar102 = auVar12._0_4_;
      auVar169._4_4_ = uVar102;
      auVar169._0_4_ = uVar102;
      auVar169._8_4_ = uVar102;
      auVar169._12_4_ = uVar102;
      auVar172 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      aVar5 = (pre->ray_space).vx.field_0;
      aVar6 = (pre->ray_space).vy.field_0;
      fVar147 = (pre->ray_space).vz.field_0.m128[0];
      fVar120 = (pre->ray_space).vz.field_0.m128[1];
      fVar122 = (pre->ray_space).vz.field_0.m128[2];
      fVar124 = (pre->ray_space).vz.field_0.m128[3];
      auVar188._0_4_ = auVar12._0_4_ * fVar147;
      auVar188._4_4_ = auVar12._4_4_ * fVar120;
      auVar188._8_4_ = auVar12._8_4_ * fVar122;
      auVar188._12_4_ = auVar12._12_4_ * fVar124;
      auVar172 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar6,auVar172);
      auVar16 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar5,auVar169);
      auVar172 = vblendps_avx(auVar16,*(undefined1 (*) [16])pPVar1,8);
      auVar13 = vsubps_avx(local_560,(undefined1  [16])aVar4);
      uVar102 = auVar13._0_4_;
      auVar189._4_4_ = uVar102;
      auVar189._0_4_ = uVar102;
      auVar189._8_4_ = uVar102;
      auVar189._12_4_ = uVar102;
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar204._0_4_ = auVar13._0_4_ * fVar147;
      auVar204._4_4_ = auVar13._4_4_ * fVar120;
      auVar204._8_4_ = auVar13._8_4_ * fVar122;
      auVar204._12_4_ = auVar13._12_4_ * fVar124;
      auVar12 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar6,auVar12);
      auVar108 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar5,auVar189);
      auVar12 = vblendps_avx(auVar108,local_560,8);
      auVar106 = local_570;
      auVar14 = vsubps_avx(local_570,(undefined1  [16])aVar4);
      uVar102 = auVar14._0_4_;
      auVar194._4_4_ = uVar102;
      auVar194._0_4_ = uVar102;
      auVar194._8_4_ = uVar102;
      auVar194._12_4_ = uVar102;
      auVar13 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar218._0_4_ = auVar14._0_4_ * fVar147;
      auVar218._4_4_ = auVar14._4_4_ * fVar120;
      auVar218._8_4_ = auVar14._8_4_ * fVar122;
      auVar218._12_4_ = auVar14._12_4_ * fVar124;
      auVar13 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar6,auVar13);
      auVar107 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar5,auVar194);
      auVar13 = vblendps_avx(auVar107,local_570,8);
      auVar131 = _local_580;
      auVar15 = vsubps_avx(_local_580,(undefined1  [16])aVar4);
      uVar102 = auVar15._0_4_;
      auVar195._4_4_ = uVar102;
      auVar195._0_4_ = uVar102;
      auVar195._8_4_ = uVar102;
      auVar195._12_4_ = uVar102;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      auVar221._0_4_ = auVar15._0_4_ * fVar147;
      auVar221._4_4_ = auVar15._4_4_ * fVar120;
      auVar221._8_4_ = auVar15._8_4_ * fVar122;
      auVar221._12_4_ = auVar15._12_4_ * fVar124;
      auVar14 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar6,auVar14);
      auVar149 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar5,auVar195);
      auVar14 = vblendps_avx(auVar149,_local_580,8);
      auVar172 = vandps_avx(auVar172,local_170);
      auVar12 = vandps_avx(auVar12,local_170);
      auVar15 = vmaxps_avx(auVar172,auVar12);
      auVar172 = vandps_avx(auVar13,local_170);
      auVar12 = vandps_avx(auVar14,local_170);
      auVar172 = vmaxps_avx(auVar172,auVar12);
      auVar172 = vmaxps_avx(auVar15,auVar172);
      auVar12 = vmovshdup_avx(auVar172);
      auVar12 = vmaxss_avx(auVar12,auVar172);
      auVar172 = vshufpd_avx(auVar172,auVar172,1);
      auVar172 = vmaxss_avx(auVar172,auVar12);
      lVar22 = (long)iVar9 * 0x44;
      auVar12 = vmovshdup_avx(auVar16);
      uVar104 = auVar12._0_8_;
      local_420._8_8_ = uVar104;
      local_420._0_8_ = uVar104;
      local_420._16_8_ = uVar104;
      local_420._24_8_ = uVar104;
      auVar12 = vmovshdup_avx(auVar108);
      uVar104 = auVar12._0_8_;
      local_4e0._8_8_ = uVar104;
      local_4e0._0_8_ = uVar104;
      local_4e0._16_8_ = uVar104;
      local_4e0._24_8_ = uVar104;
      auVar140 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x908);
      uVar216 = auVar107._0_4_;
      local_4c0._4_4_ = uVar216;
      local_4c0._0_4_ = uVar216;
      local_4c0._8_4_ = uVar216;
      local_4c0._12_4_ = uVar216;
      local_4c0._16_4_ = uVar216;
      local_4c0._20_4_ = uVar216;
      local_4c0._24_4_ = uVar216;
      local_4c0._28_4_ = uVar216;
      auVar12 = vmovshdup_avx(auVar107);
      uVar104 = auVar12._0_8_;
      auVar190._8_8_ = uVar104;
      auVar190._0_8_ = uVar104;
      auVar190._16_8_ = uVar104;
      auVar190._24_8_ = uVar104;
      fVar147 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar22 + 0xd8c);
      auVar92 = *(undefined1 (*) [28])(bspline_basis0 + lVar22 + 0xd8c);
      local_5a0 = auVar149._0_4_;
      auVar12 = vmovshdup_avx(auVar149);
      local_620 = auVar12._0_8_;
      auVar196._4_4_ = local_5a0 * *(float *)(bspline_basis0 + lVar22 + 0xd90);
      auVar196._0_4_ = local_5a0 * fVar147;
      auVar196._8_4_ = local_5a0 * *(float *)(bspline_basis0 + lVar22 + 0xd94);
      auVar196._12_4_ = local_5a0 * *(float *)(bspline_basis0 + lVar22 + 0xd98);
      auVar196._16_4_ = local_5a0 * *(float *)(bspline_basis0 + lVar22 + 0xd9c);
      auVar196._20_4_ = local_5a0 * *(float *)(bspline_basis0 + lVar22 + 0xda0);
      auVar196._24_4_ = local_5a0 * *(float *)(bspline_basis0 + lVar22 + 0xda4);
      auVar196._28_4_ = *(undefined4 *)(bspline_basis0 + lVar22 + 0xda8);
      auVar13 = vfmadd231ps_fma(auVar196,auVar140,local_4c0);
      fVar161 = auVar12._0_4_;
      auVar116._0_4_ = fVar161 * fVar147;
      fVar166 = auVar12._4_4_;
      auVar116._4_4_ = fVar166 * *(float *)(bspline_basis0 + lVar22 + 0xd90);
      auVar116._8_4_ = fVar161 * *(float *)(bspline_basis0 + lVar22 + 0xd94);
      auVar116._12_4_ = fVar166 * *(float *)(bspline_basis0 + lVar22 + 0xd98);
      auVar116._16_4_ = fVar161 * *(float *)(bspline_basis0 + lVar22 + 0xd9c);
      auVar116._20_4_ = fVar166 * *(float *)(bspline_basis0 + lVar22 + 0xda0);
      auVar116._24_4_ = fVar161 * *(float *)(bspline_basis0 + lVar22 + 0xda4);
      auVar116._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar116,auVar140,auVar190);
      auVar196 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x484);
      uVar102 = auVar108._0_4_;
      local_600._4_4_ = uVar102;
      local_600._0_4_ = uVar102;
      local_600._8_4_ = uVar102;
      local_600._12_4_ = uVar102;
      local_600._16_4_ = uVar102;
      local_600._20_4_ = uVar102;
      local_600._24_4_ = uVar102;
      local_600._28_4_ = uVar102;
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar196,local_600);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar196,local_4e0);
      auVar116 = *(undefined1 (*) [32])(bspline_basis0 + lVar22);
      local_400._0_4_ = auVar16._0_4_;
      local_5e0._4_4_ = local_400._0_4_;
      local_5e0._0_4_ = local_400._0_4_;
      local_5e0._8_4_ = local_400._0_4_;
      local_5e0._12_4_ = local_400._0_4_;
      local_5e0._16_4_ = local_400._0_4_;
      local_5e0._20_4_ = local_400._0_4_;
      local_5e0._24_4_ = local_400._0_4_;
      local_5e0._28_4_ = local_400._0_4_;
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar116,local_5e0);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar116,local_420);
      auVar137 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x908);
      fVar121 = *(float *)(bspline_basis1 + lVar22 + 0xd8c);
      fVar123 = *(float *)(bspline_basis1 + lVar22 + 0xd90);
      fVar125 = *(float *)(bspline_basis1 + lVar22 + 0xd94);
      fVar126 = *(float *)(bspline_basis1 + lVar22 + 0xd98);
      fVar127 = *(float *)(bspline_basis1 + lVar22 + 0xd9c);
      fVar128 = *(float *)(bspline_basis1 + lVar22 + 0xda0);
      fVar148 = *(float *)(bspline_basis1 + lVar22 + 0xda4);
      fStack_59c = local_5a0;
      fStack_598 = local_5a0;
      fStack_594 = local_5a0;
      fStack_590 = local_5a0;
      fStack_58c = local_5a0;
      fStack_588 = local_5a0;
      fStack_584 = local_5a0;
      auVar208._4_4_ = fVar123 * local_5a0;
      auVar208._0_4_ = fVar121 * local_5a0;
      auVar208._8_4_ = fVar125 * local_5a0;
      auVar208._12_4_ = fVar126 * local_5a0;
      auVar208._16_4_ = fVar127 * local_5a0;
      auVar208._20_4_ = fVar128 * local_5a0;
      auVar208._24_4_ = fVar148 * local_5a0;
      auVar208._28_4_ = *(undefined4 *)(bspline_basis0 + lVar22 + 0xda8);
      auVar14 = vfmadd231ps_fma(auVar208,auVar137,local_4c0);
      uStack_618 = local_620;
      uStack_610 = local_620;
      uStack_608 = local_620;
      auVar200._4_4_ = fVar123 * fVar166;
      auVar200._0_4_ = fVar121 * fVar161;
      auVar200._8_4_ = fVar125 * fVar161;
      auVar200._12_4_ = fVar126 * fVar166;
      auVar200._16_4_ = fVar127 * fVar161;
      auVar200._20_4_ = fVar128 * fVar166;
      auVar200._24_4_ = fVar148 * fVar161;
      auVar200._28_4_ = uVar216;
      local_680 = auVar190;
      auVar15 = vfmadd231ps_fma(auVar200,auVar137,auVar190);
      auVar208 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x484);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar208,local_600);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar208,local_4e0);
      auVar200 = *(undefined1 (*) [32])(bspline_basis1 + lVar22);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar200,local_5e0);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar200,local_420);
      local_1c0 = ZEXT1632(auVar14);
      local_1a0 = ZEXT1632(auVar13);
      auVar17 = vsubps_avx(local_1c0,local_1a0);
      local_1e0 = ZEXT1632(auVar15);
      local_200 = ZEXT1632(auVar12);
      local_220 = vsubps_avx(local_1e0,local_200);
      auVar110._0_4_ = auVar12._0_4_ * auVar17._0_4_;
      auVar110._4_4_ = auVar12._4_4_ * auVar17._4_4_;
      auVar110._8_4_ = auVar12._8_4_ * auVar17._8_4_;
      auVar110._12_4_ = auVar12._12_4_ * auVar17._12_4_;
      auVar110._16_4_ = auVar17._16_4_ * 0.0;
      auVar110._20_4_ = auVar17._20_4_ * 0.0;
      auVar110._24_4_ = auVar17._24_4_ * 0.0;
      auVar110._28_4_ = 0;
      fVar147 = local_220._0_4_;
      auVar133._0_4_ = auVar13._0_4_ * fVar147;
      fVar120 = local_220._4_4_;
      auVar133._4_4_ = auVar13._4_4_ * fVar120;
      fVar122 = local_220._8_4_;
      auVar133._8_4_ = auVar13._8_4_ * fVar122;
      fVar124 = local_220._12_4_;
      auVar133._12_4_ = auVar13._12_4_ * fVar124;
      fVar229 = local_220._16_4_;
      auVar133._16_4_ = fVar229 * 0.0;
      fVar230 = local_220._20_4_;
      auVar133._20_4_ = fVar230 * 0.0;
      fVar103 = local_220._24_4_;
      auVar133._24_4_ = fVar103 * 0.0;
      auVar133._28_4_ = 0;
      auVar110 = vsubps_avx(auVar110,auVar133);
      auVar12 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar104 = auVar12._0_8_;
      local_80._8_8_ = uVar104;
      local_80._0_8_ = uVar104;
      local_80._16_8_ = uVar104;
      local_80._24_8_ = uVar104;
      auVar13 = vpermilps_avx(local_560,0xff);
      uVar104 = auVar13._0_8_;
      local_a0._8_8_ = uVar104;
      local_a0._0_8_ = uVar104;
      local_a0._16_8_ = uVar104;
      local_a0._24_8_ = uVar104;
      auVar13 = vpermilps_avx(local_570,0xff);
      uVar104 = auVar13._0_8_;
      local_c0._8_8_ = uVar104;
      local_c0._0_8_ = uVar104;
      local_c0._16_8_ = uVar104;
      local_c0._24_8_ = uVar104;
      auVar13 = vpermilps_avx(_local_580,0xff);
      local_e0 = auVar13._0_8_;
      local_780._0_4_ = auVar92._0_4_;
      local_780._4_4_ = auVar92._4_4_;
      fStack_778 = auVar92._8_4_;
      fStack_774 = auVar92._12_4_;
      fStack_770 = auVar92._16_4_;
      fStack_76c = auVar92._20_4_;
      fStack_768 = auVar92._24_4_;
      fVar129 = auVar13._0_4_;
      fVar146 = auVar13._4_4_;
      auVar117._4_4_ = fVar146 * (float)local_780._4_4_;
      auVar117._0_4_ = fVar129 * (float)local_780._0_4_;
      auVar117._8_4_ = fVar129 * fStack_778;
      auVar117._12_4_ = fVar146 * fStack_774;
      auVar117._16_4_ = fVar129 * fStack_770;
      auVar117._20_4_ = fVar146 * fStack_76c;
      auVar117._24_4_ = fVar129 * fStack_768;
      auVar117._28_4_ = local_400._0_4_;
      auVar13 = vfmadd231ps_fma(auVar117,local_c0,auVar140);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar196,local_a0);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar116,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar21._4_4_ = fVar123 * fVar146;
      auVar21._0_4_ = fVar121 * fVar129;
      auVar21._8_4_ = fVar125 * fVar129;
      auVar21._12_4_ = fVar126 * fVar146;
      auVar21._16_4_ = fVar127 * fVar129;
      auVar21._20_4_ = fVar128 * fVar146;
      auVar21._24_4_ = fVar148 * fVar129;
      auVar21._28_4_ = auVar116._28_4_;
      auVar14 = vfmadd231ps_fma(auVar21,auVar137,local_c0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar208,local_a0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar200,local_80);
      auVar19._4_4_ = fVar120 * fVar120;
      auVar19._0_4_ = fVar147 * fVar147;
      auVar19._8_4_ = fVar122 * fVar122;
      auVar19._12_4_ = fVar124 * fVar124;
      auVar19._16_4_ = fVar229 * fVar229;
      auVar19._20_4_ = fVar230 * fVar230;
      auVar19._24_4_ = fVar103 * fVar103;
      auVar19._28_4_ = auVar12._4_4_;
      auVar12 = vfmadd231ps_fma(auVar19,auVar17,auVar17);
      auVar117 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
      auVar20._4_4_ = auVar117._4_4_ * auVar117._4_4_ * auVar12._4_4_;
      auVar20._0_4_ = auVar117._0_4_ * auVar117._0_4_ * auVar12._0_4_;
      auVar20._8_4_ = auVar117._8_4_ * auVar117._8_4_ * auVar12._8_4_;
      auVar20._12_4_ = auVar117._12_4_ * auVar117._12_4_ * auVar12._12_4_;
      auVar20._16_4_ = auVar117._16_4_ * auVar117._16_4_ * 0.0;
      auVar20._20_4_ = auVar117._20_4_ * auVar117._20_4_ * 0.0;
      auVar20._24_4_ = auVar117._24_4_ * auVar117._24_4_ * 0.0;
      auVar20._28_4_ = auVar117._28_4_;
      auVar18._4_4_ = auVar110._4_4_ * auVar110._4_4_;
      auVar18._0_4_ = auVar110._0_4_ * auVar110._0_4_;
      auVar18._8_4_ = auVar110._8_4_ * auVar110._8_4_;
      auVar18._12_4_ = auVar110._12_4_ * auVar110._12_4_;
      auVar18._16_4_ = auVar110._16_4_ * auVar110._16_4_;
      auVar18._20_4_ = auVar110._20_4_ * auVar110._20_4_;
      auVar18._24_4_ = auVar110._24_4_ * auVar110._24_4_;
      auVar18._28_4_ = auVar110._28_4_;
      auVar117 = vcmpps_avx(auVar18,auVar20,2);
      fVar147 = auVar172._0_4_ * 4.7683716e-07;
      local_3c0._0_4_ = (undefined4)iVar9;
      register0x00001204 = auVar149._4_12_;
      auVar111._4_4_ = local_3c0._0_4_;
      auVar111._0_4_ = local_3c0._0_4_;
      auVar111._8_4_ = local_3c0._0_4_;
      auVar111._12_4_ = local_3c0._0_4_;
      auVar111._16_4_ = local_3c0._0_4_;
      auVar111._20_4_ = local_3c0._0_4_;
      auVar111._24_4_ = local_3c0._0_4_;
      auVar111._28_4_ = local_3c0._0_4_;
      auVar110 = vcmpps_avx(_DAT_02020f40,auVar111,1);
      auVar12 = vpermilps_avx(auVar16,0xaa);
      uVar104 = auVar12._0_8_;
      auVar163._8_8_ = uVar104;
      auVar163._0_8_ = uVar104;
      auVar163._16_8_ = uVar104;
      auVar163._24_8_ = uVar104;
      auVar165 = ZEXT3264(auVar163);
      auVar172 = vpermilps_avx(auVar108,0xaa);
      uVar104 = auVar172._0_8_;
      local_100._8_8_ = uVar104;
      local_100._0_8_ = uVar104;
      local_100._16_8_ = uVar104;
      local_100._24_8_ = uVar104;
      auVar172 = vpermilps_avx(auVar107,0xaa);
      uVar104 = auVar172._0_8_;
      local_400._8_8_ = uVar104;
      local_400._0_8_ = uVar104;
      local_400._16_8_ = uVar104;
      local_400._24_8_ = uVar104;
      auVar172 = vshufps_avx(auVar149,auVar149,0xaa);
      uVar104 = auVar172._0_8_;
      register0x00001508 = uVar104;
      local_5c0 = uVar104;
      register0x00001510 = uVar104;
      register0x00001518 = uVar104;
      auVar224 = ZEXT3264(_local_5c0);
      auVar21 = auVar110 & auVar117;
      uVar94 = *(uint *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_500._0_16_ = ZEXT416(uVar94);
      fVar120 = fVar161;
      fVar122 = fVar166;
      fVar124 = fVar161;
      fVar229 = fVar166;
      fVar230 = fVar161;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0x7f,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0xbf,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
      {
        auVar215 = ZEXT3264(local_660);
        auVar209 = ZEXT3264(local_6a0);
        auVar145 = ZEXT3264(local_4e0);
        auVar202 = ZEXT3264(auVar190);
        auVar197 = ZEXT3264(local_600);
        auVar192 = ZEXT3264(local_5e0);
      }
      else {
        _local_4a0 = vandps_avx(auVar117,auVar110);
        fVar129 = auVar172._0_4_;
        fVar146 = auVar172._4_4_;
        auVar24._4_4_ = fVar146 * fVar123;
        auVar24._0_4_ = fVar129 * fVar121;
        auVar24._8_4_ = fVar129 * fVar125;
        auVar24._12_4_ = fVar146 * fVar126;
        auVar24._16_4_ = fVar129 * fVar127;
        auVar24._20_4_ = fVar146 * fVar128;
        auVar24._24_4_ = fVar129 * fVar148;
        auVar24._28_4_ = local_4a0._28_4_;
        auVar172 = vfmadd213ps_fma(auVar137,local_400,auVar24);
        auVar172 = vfmadd213ps_fma(auVar208,local_100,ZEXT1632(auVar172));
        auVar172 = vfmadd213ps_fma(auVar200,auVar163,ZEXT1632(auVar172));
        auVar112._0_4_ = fVar129 * (float)local_780._0_4_;
        auVar112._4_4_ = fVar146 * (float)local_780._4_4_;
        auVar112._8_4_ = fVar129 * fStack_778;
        auVar112._12_4_ = fVar146 * fStack_774;
        auVar112._16_4_ = fVar129 * fStack_770;
        auVar112._20_4_ = fVar146 * fStack_76c;
        auVar112._24_4_ = fVar129 * fStack_768;
        auVar112._28_4_ = 0;
        auVar15 = vfmadd213ps_fma(auVar140,local_400,auVar112);
        auVar15 = vfmadd213ps_fma(auVar196,local_100,ZEXT1632(auVar15));
        auVar196 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1210);
        auVar137 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1694);
        auVar208 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1b18);
        fVar103 = *(float *)(bspline_basis0 + lVar22 + 0x1f9c);
        fVar121 = *(float *)(bspline_basis0 + lVar22 + 0x1fa0);
        fVar123 = *(float *)(bspline_basis0 + lVar22 + 0x1fa4);
        fVar125 = *(float *)(bspline_basis0 + lVar22 + 0x1fa8);
        fVar126 = *(float *)(bspline_basis0 + lVar22 + 0x1fac);
        fVar127 = *(float *)(bspline_basis0 + lVar22 + 0x1fb0);
        fVar128 = *(float *)(bspline_basis0 + lVar22 + 0x1fb4);
        auVar184._0_4_ = local_5a0 * fVar103;
        auVar184._4_4_ = local_5a0 * fVar121;
        auVar184._8_4_ = local_5a0 * fVar123;
        auVar184._12_4_ = local_5a0 * fVar125;
        auVar184._16_4_ = local_5a0 * fVar126;
        auVar184._20_4_ = local_5a0 * fVar127;
        auVar184._24_4_ = local_5a0 * fVar128;
        auVar184._28_4_ = 0;
        auVar25._4_4_ = fVar166 * fVar121;
        auVar25._0_4_ = fVar161 * fVar103;
        auVar25._8_4_ = fVar161 * fVar123;
        auVar25._12_4_ = fVar166 * fVar125;
        auVar25._16_4_ = fVar161 * fVar126;
        auVar25._20_4_ = fVar166 * fVar127;
        auVar25._24_4_ = fVar161 * fVar128;
        auVar25._28_4_ = *(undefined4 *)(bspline_basis1 + lVar22 + 0xda8);
        auVar26._4_4_ = fVar121 * fVar146;
        auVar26._0_4_ = fVar103 * fVar129;
        auVar26._8_4_ = fVar123 * fVar129;
        auVar26._12_4_ = fVar125 * fVar146;
        auVar26._16_4_ = fVar126 * fVar129;
        auVar26._20_4_ = fVar127 * fVar146;
        auVar26._24_4_ = fVar128 * fVar129;
        auVar26._28_4_ = auVar17._28_4_;
        local_700._16_16_ = auVar140._16_16_;
        local_700._0_16_ = ZEXT416((uint)fVar147);
        auVar16 = vfmadd231ps_fma(auVar184,auVar208,local_4c0);
        auVar108 = vfmadd231ps_fma(auVar25,auVar208,auVar190);
        auVar107 = vfmadd231ps_fma(auVar26,local_400,auVar208);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar137,local_600);
        local_520 = auVar163;
        auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar137,local_4e0);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_100,auVar137);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar196,local_5e0);
        auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar196,local_420);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar163,auVar196);
        fVar103 = *(float *)(bspline_basis1 + lVar22 + 0x1f9c);
        fVar121 = *(float *)(bspline_basis1 + lVar22 + 0x1fa0);
        fVar123 = *(float *)(bspline_basis1 + lVar22 + 0x1fa4);
        fVar125 = *(float *)(bspline_basis1 + lVar22 + 0x1fa8);
        fVar126 = *(float *)(bspline_basis1 + lVar22 + 0x1fac);
        fVar127 = *(float *)(bspline_basis1 + lVar22 + 0x1fb0);
        fVar128 = *(float *)(bspline_basis1 + lVar22 + 0x1fb4);
        auVar137._4_4_ = local_5a0 * fVar121;
        auVar137._0_4_ = local_5a0 * fVar103;
        auVar137._8_4_ = local_5a0 * fVar123;
        auVar137._12_4_ = local_5a0 * fVar125;
        auVar137._16_4_ = local_5a0 * fVar126;
        auVar137._20_4_ = local_5a0 * fVar127;
        auVar137._24_4_ = local_5a0 * fVar128;
        auVar137._28_4_ = local_5a0;
        auVar27._4_4_ = fVar166 * fVar121;
        auVar27._0_4_ = fVar161 * fVar103;
        auVar27._8_4_ = fVar161 * fVar123;
        auVar27._12_4_ = fVar166 * fVar125;
        auVar27._16_4_ = fVar161 * fVar126;
        auVar27._20_4_ = fVar166 * fVar127;
        auVar27._24_4_ = fVar161 * fVar128;
        auVar27._28_4_ = fVar166;
        auVar28._4_4_ = fVar121 * fVar146;
        auVar28._0_4_ = fVar103 * fVar129;
        auVar28._8_4_ = fVar123 * fVar129;
        auVar28._12_4_ = fVar125 * fVar146;
        auVar28._16_4_ = fVar126 * fVar129;
        auVar28._20_4_ = fVar127 * fVar146;
        auVar28._24_4_ = fVar128 * fVar129;
        auVar28._28_4_ = auVar12._4_4_;
        auVar140 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1b18);
        auVar12 = vfmadd231ps_fma(auVar137,auVar140,local_4c0);
        auVar149 = vfmadd231ps_fma(auVar27,auVar140,auVar190);
        auVar162 = vfmadd231ps_fma(auVar28,auVar140,local_400);
        auVar140 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1694);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar140,local_600);
        auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar140,local_4e0);
        auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),local_100,auVar140);
        auVar140 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1210);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar140,local_5e0);
        auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar140,local_420);
        auVar134._8_4_ = 0x7fffffff;
        auVar134._0_8_ = 0x7fffffff7fffffff;
        auVar134._12_4_ = 0x7fffffff;
        auVar134._16_4_ = 0x7fffffff;
        auVar134._20_4_ = 0x7fffffff;
        auVar134._24_4_ = 0x7fffffff;
        auVar134._28_4_ = 0x7fffffff;
        auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar163,auVar140);
        auVar140 = vandps_avx(ZEXT1632(auVar16),auVar134);
        auVar196 = vandps_avx(ZEXT1632(auVar108),auVar134);
        auVar196 = vmaxps_avx(auVar140,auVar196);
        auVar140 = vandps_avx(ZEXT1632(auVar107),auVar134);
        auVar140 = vmaxps_avx(auVar196,auVar140);
        auVar158._4_4_ = fVar147;
        auVar158._0_4_ = fVar147;
        auVar158._8_4_ = fVar147;
        auVar158._12_4_ = fVar147;
        auVar158._16_4_ = fVar147;
        auVar158._20_4_ = fVar147;
        auVar158._24_4_ = fVar147;
        auVar158._28_4_ = fVar147;
        auVar140 = vcmpps_avx(auVar140,auVar158,1);
        auVar137 = vblendvps_avx(ZEXT1632(auVar16),auVar17,auVar140);
        auVar208 = vblendvps_avx(ZEXT1632(auVar108),local_220,auVar140);
        auVar140 = vandps_avx(ZEXT1632(auVar12),auVar134);
        auVar196 = vandps_avx(ZEXT1632(auVar149),auVar134);
        auVar200 = vmaxps_avx(auVar140,auVar196);
        auVar140 = vandps_avx(ZEXT1632(auVar162),auVar134);
        auVar140 = vmaxps_avx(auVar200,auVar140);
        auVar117 = vcmpps_avx(auVar140,auVar158,1);
        auVar140 = vblendvps_avx(ZEXT1632(auVar12),auVar17,auVar117);
        auVar200 = vblendvps_avx(ZEXT1632(auVar149),local_220,auVar117);
        auVar12 = vfmadd213ps_fma(auVar116,auVar163,ZEXT1632(auVar15));
        auVar15 = vfmadd213ps_fma(auVar137,auVar137,ZEXT832(0) << 0x20);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar208,auVar208);
        auVar116 = vrsqrtps_avx(ZEXT1632(auVar15));
        fVar103 = auVar116._0_4_;
        fVar121 = auVar116._4_4_;
        fVar123 = auVar116._8_4_;
        fVar125 = auVar116._12_4_;
        fVar126 = auVar116._16_4_;
        fVar127 = auVar116._20_4_;
        fVar128 = auVar116._24_4_;
        auVar17._4_4_ = fVar121 * fVar121 * fVar121 * auVar15._4_4_ * -0.5;
        auVar17._0_4_ = fVar103 * fVar103 * fVar103 * auVar15._0_4_ * -0.5;
        auVar17._8_4_ = fVar123 * fVar123 * fVar123 * auVar15._8_4_ * -0.5;
        auVar17._12_4_ = fVar125 * fVar125 * fVar125 * auVar15._12_4_ * -0.5;
        auVar17._16_4_ = fVar126 * fVar126 * fVar126 * -0.0;
        auVar17._20_4_ = fVar127 * fVar127 * fVar127 * -0.0;
        auVar17._24_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar17._28_4_ = 0;
        auVar179._8_4_ = 0x3fc00000;
        auVar179._0_8_ = 0x3fc000003fc00000;
        auVar179._12_4_ = 0x3fc00000;
        auVar179._16_4_ = 0x3fc00000;
        auVar179._20_4_ = 0x3fc00000;
        auVar179._24_4_ = 0x3fc00000;
        auVar179._28_4_ = 0x3fc00000;
        auVar15 = vfmadd231ps_fma(auVar17,auVar179,auVar116);
        fVar103 = auVar15._0_4_;
        fVar121 = auVar15._4_4_;
        auVar29._4_4_ = auVar208._4_4_ * fVar121;
        auVar29._0_4_ = auVar208._0_4_ * fVar103;
        fVar123 = auVar15._8_4_;
        auVar29._8_4_ = auVar208._8_4_ * fVar123;
        fVar125 = auVar15._12_4_;
        auVar29._12_4_ = auVar208._12_4_ * fVar125;
        auVar29._16_4_ = auVar208._16_4_ * 0.0;
        auVar29._20_4_ = auVar208._20_4_ * 0.0;
        auVar29._24_4_ = auVar208._24_4_ * 0.0;
        auVar29._28_4_ = auVar116._28_4_;
        auVar30._4_4_ = -auVar137._4_4_ * fVar121;
        auVar30._0_4_ = -auVar137._0_4_ * fVar103;
        auVar30._8_4_ = -auVar137._8_4_ * fVar123;
        auVar30._12_4_ = -auVar137._12_4_ * fVar125;
        auVar30._16_4_ = -auVar137._16_4_ * 0.0;
        auVar30._20_4_ = -auVar137._20_4_ * 0.0;
        auVar30._24_4_ = -auVar137._24_4_ * 0.0;
        auVar30._28_4_ = auVar196._28_4_;
        auVar15 = vfmadd213ps_fma(auVar140,auVar140,ZEXT832(0) << 0x20);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar200,auVar200);
        auVar196 = vrsqrtps_avx(ZEXT1632(auVar15));
        auVar31._28_4_ = auVar117._28_4_;
        auVar31._0_28_ =
             ZEXT1628(CONCAT412(fVar125 * 0.0,
                                CONCAT48(fVar123 * 0.0,CONCAT44(fVar121 * 0.0,fVar103 * 0.0))));
        fVar103 = auVar196._0_4_;
        fVar121 = auVar196._4_4_;
        fVar123 = auVar196._8_4_;
        fVar125 = auVar196._12_4_;
        fVar126 = auVar196._16_4_;
        fVar127 = auVar196._20_4_;
        fVar128 = auVar196._24_4_;
        auVar32._4_4_ = fVar121 * fVar121 * fVar121 * auVar15._4_4_ * -0.5;
        auVar32._0_4_ = fVar103 * fVar103 * fVar103 * auVar15._0_4_ * -0.5;
        auVar32._8_4_ = fVar123 * fVar123 * fVar123 * auVar15._8_4_ * -0.5;
        auVar32._12_4_ = fVar125 * fVar125 * fVar125 * auVar15._12_4_ * -0.5;
        auVar32._16_4_ = fVar126 * fVar126 * fVar126 * -0.0;
        auVar32._20_4_ = fVar127 * fVar127 * fVar127 * -0.0;
        auVar32._24_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar32._28_4_ = 0;
        auVar15 = vfmadd231ps_fma(auVar32,auVar179,auVar196);
        fVar103 = auVar15._0_4_;
        fVar121 = auVar15._4_4_;
        auVar33._4_4_ = auVar200._4_4_ * fVar121;
        auVar33._0_4_ = auVar200._0_4_ * fVar103;
        fVar123 = auVar15._8_4_;
        auVar33._8_4_ = auVar200._8_4_ * fVar123;
        fVar125 = auVar15._12_4_;
        auVar33._12_4_ = auVar200._12_4_ * fVar125;
        auVar33._16_4_ = auVar200._16_4_ * 0.0;
        auVar33._20_4_ = auVar200._20_4_ * 0.0;
        auVar33._24_4_ = auVar200._24_4_ * 0.0;
        auVar33._28_4_ = 0;
        auVar34._4_4_ = -auVar140._4_4_ * fVar121;
        auVar34._0_4_ = -auVar140._0_4_ * fVar103;
        auVar34._8_4_ = -auVar140._8_4_ * fVar123;
        auVar34._12_4_ = -auVar140._12_4_ * fVar125;
        auVar34._16_4_ = -auVar140._16_4_ * 0.0;
        auVar34._20_4_ = -auVar140._20_4_ * 0.0;
        auVar34._24_4_ = -auVar140._24_4_ * 0.0;
        auVar34._28_4_ = auVar200._28_4_;
        auVar140._28_4_ = auVar196._28_4_;
        auVar140._0_28_ =
             ZEXT1628(CONCAT412(fVar125 * 0.0,
                                CONCAT48(fVar123 * 0.0,CONCAT44(fVar121 * 0.0,fVar103 * 0.0))));
        auVar15 = vfmadd213ps_fma(auVar29,ZEXT1632(auVar13),local_1a0);
        local_640 = ZEXT1632(auVar15);
        auVar196 = ZEXT1632(auVar13);
        auVar16 = vfmadd213ps_fma(auVar30,auVar196,local_200);
        auVar108 = vfmadd213ps_fma(auVar31,auVar196,ZEXT1632(auVar12));
        auVar162 = vfnmadd213ps_fma(auVar29,auVar196,local_1a0);
        auVar107 = vfmadd213ps_fma(auVar33,ZEXT1632(auVar14),local_1c0);
        auVar168 = vfnmadd213ps_fma(auVar30,auVar196,local_200);
        auVar196 = ZEXT1632(auVar14);
        auVar149 = vfmadd213ps_fma(auVar34,auVar196,local_1e0);
        _local_780 = ZEXT1632(auVar13);
        auVar167 = vfnmadd231ps_fma(ZEXT1632(auVar12),_local_780,auVar31);
        auVar12 = vfmadd213ps_fma(auVar140,auVar196,ZEXT1632(auVar172));
        auVar105 = vfnmadd213ps_fma(auVar33,auVar196,local_1c0);
        auVar130 = vfnmadd213ps_fma(auVar34,auVar196,local_1e0);
        _local_480 = ZEXT1632(auVar14);
        auVar181 = vfnmadd231ps_fma(ZEXT1632(auVar172),_local_480,auVar140);
        auVar140 = vsubps_avx(ZEXT1632(auVar149),ZEXT1632(auVar168));
        auVar196 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar167));
        auVar35._4_4_ = auVar167._4_4_ * auVar140._4_4_;
        auVar35._0_4_ = auVar167._0_4_ * auVar140._0_4_;
        auVar35._8_4_ = auVar167._8_4_ * auVar140._8_4_;
        auVar35._12_4_ = auVar167._12_4_ * auVar140._12_4_;
        auVar35._16_4_ = auVar140._16_4_ * 0.0;
        auVar35._20_4_ = auVar140._20_4_ * 0.0;
        auVar35._24_4_ = auVar140._24_4_ * 0.0;
        auVar35._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar35,ZEXT1632(auVar168),auVar196);
        auVar36._4_4_ = auVar162._4_4_ * auVar196._4_4_;
        auVar36._0_4_ = auVar162._0_4_ * auVar196._0_4_;
        auVar36._8_4_ = auVar162._8_4_ * auVar196._8_4_;
        auVar36._12_4_ = auVar162._12_4_ * auVar196._12_4_;
        auVar36._16_4_ = auVar196._16_4_ * 0.0;
        auVar36._20_4_ = auVar196._20_4_ * 0.0;
        auVar36._24_4_ = auVar196._24_4_ * 0.0;
        auVar36._28_4_ = auVar196._28_4_;
        auVar200 = ZEXT1632(auVar162);
        auVar196 = vsubps_avx(ZEXT1632(auVar107),auVar200);
        auVar172 = vfmsub231ps_fma(auVar36,ZEXT1632(auVar167),auVar196);
        auVar37._4_4_ = auVar168._4_4_ * auVar196._4_4_;
        auVar37._0_4_ = auVar168._0_4_ * auVar196._0_4_;
        auVar37._8_4_ = auVar168._8_4_ * auVar196._8_4_;
        auVar37._12_4_ = auVar168._12_4_ * auVar196._12_4_;
        auVar37._16_4_ = auVar196._16_4_ * 0.0;
        auVar37._20_4_ = auVar196._20_4_ * 0.0;
        auVar37._24_4_ = auVar196._24_4_ * 0.0;
        auVar37._28_4_ = auVar196._28_4_;
        auVar14 = vfmsub231ps_fma(auVar37,auVar200,auVar140);
        auVar172 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar172));
        auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar17 = vcmpps_avx(ZEXT1632(auVar172),ZEXT832(0) << 0x20,2);
        auVar165 = ZEXT3264(auVar17);
        local_720 = vblendvps_avx(ZEXT1632(auVar105),ZEXT1632(auVar15),auVar17);
        auVar140 = vblendvps_avx(ZEXT1632(auVar130),ZEXT1632(auVar16),auVar17);
        auVar196 = vblendvps_avx(ZEXT1632(auVar181),ZEXT1632(auVar108),auVar17);
        auVar116 = vblendvps_avx(auVar200,ZEXT1632(auVar107),auVar17);
        auVar137 = vblendvps_avx(ZEXT1632(auVar168),ZEXT1632(auVar149),auVar17);
        auVar208 = vblendvps_avx(ZEXT1632(auVar167),ZEXT1632(auVar12),auVar17);
        auVar200 = vblendvps_avx(ZEXT1632(auVar107),auVar200,auVar17);
        auVar117 = vblendvps_avx(ZEXT1632(auVar149),ZEXT1632(auVar168),auVar17);
        auVar172 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
        auVar110 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar167),auVar17);
        auVar21 = vsubps_avx(auVar200,local_720);
        auVar117 = vsubps_avx(auVar117,auVar140);
        auVar19 = vsubps_avx(auVar110,auVar196);
        auVar20 = vsubps_avx(local_720,auVar116);
        auVar18 = vsubps_avx(auVar140,auVar137);
        auVar111 = vsubps_avx(auVar196,auVar208);
        auVar38._4_4_ = auVar19._4_4_ * local_720._4_4_;
        auVar38._0_4_ = auVar19._0_4_ * local_720._0_4_;
        auVar38._8_4_ = auVar19._8_4_ * local_720._8_4_;
        auVar38._12_4_ = auVar19._12_4_ * local_720._12_4_;
        auVar38._16_4_ = auVar19._16_4_ * local_720._16_4_;
        auVar38._20_4_ = auVar19._20_4_ * local_720._20_4_;
        auVar38._24_4_ = auVar19._24_4_ * local_720._24_4_;
        auVar38._28_4_ = auVar110._28_4_;
        auVar12 = vfmsub231ps_fma(auVar38,auVar196,auVar21);
        auVar39._4_4_ = auVar21._4_4_ * auVar140._4_4_;
        auVar39._0_4_ = auVar21._0_4_ * auVar140._0_4_;
        auVar39._8_4_ = auVar21._8_4_ * auVar140._8_4_;
        auVar39._12_4_ = auVar21._12_4_ * auVar140._12_4_;
        auVar39._16_4_ = auVar21._16_4_ * auVar140._16_4_;
        auVar39._20_4_ = auVar21._20_4_ * auVar140._20_4_;
        auVar39._24_4_ = auVar21._24_4_ * auVar140._24_4_;
        auVar39._28_4_ = auVar200._28_4_;
        auVar13 = vfmsub231ps_fma(auVar39,local_720,auVar117);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar113._0_4_ = auVar117._0_4_ * auVar196._0_4_;
        auVar113._4_4_ = auVar117._4_4_ * auVar196._4_4_;
        auVar113._8_4_ = auVar117._8_4_ * auVar196._8_4_;
        auVar113._12_4_ = auVar117._12_4_ * auVar196._12_4_;
        auVar113._16_4_ = auVar117._16_4_ * auVar196._16_4_;
        auVar113._20_4_ = auVar117._20_4_ * auVar196._20_4_;
        auVar113._24_4_ = auVar117._24_4_ * auVar196._24_4_;
        auVar113._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar113,auVar140,auVar19);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar114._0_4_ = auVar111._0_4_ * auVar116._0_4_;
        auVar114._4_4_ = auVar111._4_4_ * auVar116._4_4_;
        auVar114._8_4_ = auVar111._8_4_ * auVar116._8_4_;
        auVar114._12_4_ = auVar111._12_4_ * auVar116._12_4_;
        auVar114._16_4_ = auVar111._16_4_ * auVar116._16_4_;
        auVar114._20_4_ = auVar111._20_4_ * auVar116._20_4_;
        auVar114._24_4_ = auVar111._24_4_ * auVar116._24_4_;
        auVar114._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar114,auVar20,auVar208);
        auVar40._4_4_ = auVar18._4_4_ * auVar208._4_4_;
        auVar40._0_4_ = auVar18._0_4_ * auVar208._0_4_;
        auVar40._8_4_ = auVar18._8_4_ * auVar208._8_4_;
        auVar40._12_4_ = auVar18._12_4_ * auVar208._12_4_;
        auVar40._16_4_ = auVar18._16_4_ * auVar208._16_4_;
        auVar40._20_4_ = auVar18._20_4_ * auVar208._20_4_;
        auVar40._24_4_ = auVar18._24_4_ * auVar208._24_4_;
        auVar40._28_4_ = auVar208._28_4_;
        auVar14 = vfmsub231ps_fma(auVar40,auVar137,auVar111);
        auVar41._4_4_ = auVar20._4_4_ * auVar137._4_4_;
        auVar41._0_4_ = auVar20._0_4_ * auVar137._0_4_;
        auVar41._8_4_ = auVar20._8_4_ * auVar137._8_4_;
        auVar41._12_4_ = auVar20._12_4_ * auVar137._12_4_;
        auVar41._16_4_ = auVar20._16_4_ * auVar137._16_4_;
        auVar41._20_4_ = auVar20._20_4_ * auVar137._20_4_;
        auVar41._24_4_ = auVar20._24_4_ * auVar137._24_4_;
        auVar41._28_4_ = auVar137._28_4_;
        auVar15 = vfmsub231ps_fma(auVar41,auVar18,auVar116);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar116 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
        auVar116 = vcmpps_avx(auVar116,ZEXT832(0) << 0x20,2);
        auVar12 = vpackssdw_avx(auVar116._0_16_,auVar116._16_16_);
        auVar172 = vpand_avx(auVar172,auVar12);
        auVar116 = vpmovsxwd_avx2(auVar172);
        if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar116 >> 0x7f,0) == '\0') &&
              (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar116 >> 0xbf,0) == '\0') &&
            (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar116[0x1f]) {
LAB_0166f693:
          auVar197 = ZEXT3264(CONCAT824(local_460[1]._24_8_,
                                        CONCAT816(local_460[1]._16_8_,
                                                  CONCAT88(local_460[1]._8_8_,local_460[1]._0_8_))))
          ;
          auVar215 = ZEXT3264(local_660);
          auVar209 = ZEXT3264(local_6a0);
        }
        else {
          auVar42._4_4_ = auVar117._4_4_ * auVar111._4_4_;
          auVar42._0_4_ = auVar117._0_4_ * auVar111._0_4_;
          auVar42._8_4_ = auVar117._8_4_ * auVar111._8_4_;
          auVar42._12_4_ = auVar117._12_4_ * auVar111._12_4_;
          auVar42._16_4_ = auVar117._16_4_ * auVar111._16_4_;
          auVar42._20_4_ = auVar117._20_4_ * auVar111._20_4_;
          auVar42._24_4_ = auVar117._24_4_ * auVar111._24_4_;
          auVar42._28_4_ = auVar116._28_4_;
          auVar108 = vfmsub231ps_fma(auVar42,auVar18,auVar19);
          auVar135._0_4_ = auVar20._0_4_ * auVar19._0_4_;
          auVar135._4_4_ = auVar20._4_4_ * auVar19._4_4_;
          auVar135._8_4_ = auVar20._8_4_ * auVar19._8_4_;
          auVar135._12_4_ = auVar20._12_4_ * auVar19._12_4_;
          auVar135._16_4_ = auVar20._16_4_ * auVar19._16_4_;
          auVar135._20_4_ = auVar20._20_4_ * auVar19._20_4_;
          auVar135._24_4_ = auVar20._24_4_ * auVar19._24_4_;
          auVar135._28_4_ = 0;
          auVar16 = vfmsub231ps_fma(auVar135,auVar21,auVar111);
          auVar43._4_4_ = auVar21._4_4_ * auVar18._4_4_;
          auVar43._0_4_ = auVar21._0_4_ * auVar18._0_4_;
          auVar43._8_4_ = auVar21._8_4_ * auVar18._8_4_;
          auVar43._12_4_ = auVar21._12_4_ * auVar18._12_4_;
          auVar43._16_4_ = auVar21._16_4_ * auVar18._16_4_;
          auVar43._20_4_ = auVar21._20_4_ * auVar18._20_4_;
          auVar43._24_4_ = auVar21._24_4_ * auVar18._24_4_;
          auVar43._28_4_ = auVar21._28_4_;
          auVar107 = vfmsub231ps_fma(auVar43,auVar20,auVar117);
          auVar12 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar16),ZEXT1632(auVar107));
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar108),_DAT_02020f00);
          auVar116 = vrcpps_avx(ZEXT1632(auVar15));
          auVar219._8_4_ = 0x3f800000;
          auVar219._0_8_ = &DAT_3f8000003f800000;
          auVar219._12_4_ = 0x3f800000;
          auVar219._16_4_ = 0x3f800000;
          auVar219._20_4_ = 0x3f800000;
          auVar219._24_4_ = 0x3f800000;
          auVar219._28_4_ = 0x3f800000;
          auVar12 = vfnmadd213ps_fma(auVar116,ZEXT1632(auVar15),auVar219);
          auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar116,auVar116);
          auVar44._4_4_ = auVar107._4_4_ * auVar196._4_4_;
          auVar44._0_4_ = auVar107._0_4_ * auVar196._0_4_;
          auVar44._8_4_ = auVar107._8_4_ * auVar196._8_4_;
          auVar44._12_4_ = auVar107._12_4_ * auVar196._12_4_;
          auVar44._16_4_ = auVar196._16_4_ * 0.0;
          auVar44._20_4_ = auVar196._20_4_ * 0.0;
          auVar44._24_4_ = auVar196._24_4_ * 0.0;
          auVar44._28_4_ = auVar196._28_4_;
          auVar16 = vfmadd231ps_fma(auVar44,auVar140,ZEXT1632(auVar16));
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar108),local_720);
          fVar121 = auVar12._0_4_;
          fVar123 = auVar12._4_4_;
          fVar125 = auVar12._8_4_;
          fVar126 = auVar12._12_4_;
          auVar45._28_4_ = auVar140._28_4_;
          auVar45._0_28_ =
               ZEXT1628(CONCAT412(fVar126 * auVar16._12_4_,
                                  CONCAT48(fVar125 * auVar16._8_4_,
                                           CONCAT44(fVar123 * auVar16._4_4_,fVar121 * auVar16._0_4_)
                                          )));
          auVar115._4_4_ = uVar94;
          auVar115._0_4_ = uVar94;
          auVar115._8_4_ = uVar94;
          auVar115._12_4_ = uVar94;
          auVar115._16_4_ = uVar94;
          auVar115._20_4_ = uVar94;
          auVar115._24_4_ = uVar94;
          auVar115._28_4_ = uVar94;
          fVar103 = (ray->super_RayK<1>).tfar;
          auVar136._4_4_ = fVar103;
          auVar136._0_4_ = fVar103;
          auVar136._8_4_ = fVar103;
          auVar136._12_4_ = fVar103;
          auVar136._16_4_ = fVar103;
          auVar136._20_4_ = fVar103;
          auVar136._24_4_ = fVar103;
          auVar136._28_4_ = fVar103;
          auVar140 = vcmpps_avx(auVar115,auVar45,2);
          auVar196 = vcmpps_avx(auVar45,auVar136,2);
          auVar140 = vandps_avx(auVar196,auVar140);
          auVar12 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
          auVar172 = vpand_avx(auVar172,auVar12);
          auVar140 = vpmovsxwd_avx2(auVar172);
          if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar140 >> 0x7f,0) == '\0') &&
                (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar140 >> 0xbf,0) == '\0') &&
              (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar140[0x1f]) goto LAB_0166f693;
          auVar140 = vcmpps_avx(ZEXT1632(auVar15),ZEXT832(0) << 0x20,4);
          auVar12 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
          auVar172 = vpand_avx(auVar172,auVar12);
          auVar140 = vpmovsxwd_avx2(auVar172);
          auVar197 = ZEXT3264(CONCAT824(local_460[1]._24_8_,
                                        CONCAT816(local_460[1]._16_8_,
                                                  CONCAT88(local_460[1]._8_8_,local_460[1]._0_8_))))
          ;
          auVar215 = ZEXT3264(local_660);
          auVar209 = ZEXT3264(local_6a0);
          if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar140 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar140 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar140 >> 0x7f,0) != '\0') ||
                (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar140 >> 0xbf,0) != '\0') ||
              (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar140[0x1f] < '\0') {
            auVar116 = ZEXT1632(CONCAT412(fVar126 * auVar13._12_4_,
                                          CONCAT48(fVar125 * auVar13._8_4_,
                                                   CONCAT44(fVar123 * auVar13._4_4_,
                                                            fVar121 * auVar13._0_4_))));
            auVar137 = ZEXT1632(CONCAT412(fVar126 * auVar14._12_4_,
                                          CONCAT48(fVar125 * auVar14._8_4_,
                                                   CONCAT44(fVar123 * auVar14._4_4_,
                                                            fVar121 * auVar14._0_4_))));
            auVar180._8_4_ = 0x3f800000;
            auVar180._0_8_ = &DAT_3f8000003f800000;
            auVar180._12_4_ = 0x3f800000;
            auVar180._16_4_ = 0x3f800000;
            auVar180._20_4_ = 0x3f800000;
            auVar180._24_4_ = 0x3f800000;
            auVar180._28_4_ = 0x3f800000;
            auVar196 = vsubps_avx(auVar180,auVar116);
            auVar196 = vblendvps_avx(auVar196,auVar116,auVar17);
            auVar215 = ZEXT3264(auVar196);
            auVar196 = vsubps_avx(auVar180,auVar137);
            local_240 = vblendvps_avx(auVar196,auVar137,auVar17);
            auVar197 = ZEXT3264(auVar140);
            auVar209 = ZEXT3264(auVar45);
          }
        }
        auVar192 = ZEXT3264(auVar190);
        auVar224 = ZEXT3264(_local_5c0);
        auVar145 = ZEXT3264(auVar163);
        auVar140 = auVar197._0_32_;
        if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar140 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar140 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar140 >> 0x7f,0) != '\0') ||
              (auVar197 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar140 >> 0xbf,0) != '\0') ||
            (auVar197 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar197[0x1f] < '\0') {
          auVar196 = vsubps_avx(_local_480,_local_780);
          local_3a0 = auVar215._0_32_;
          auVar172 = vfmadd213ps_fma(auVar196,local_3a0,_local_780);
          fVar103 = pre->depth_scale;
          auVar46._4_4_ = (auVar172._4_4_ + auVar172._4_4_) * fVar103;
          auVar46._0_4_ = (auVar172._0_4_ + auVar172._0_4_) * fVar103;
          auVar46._8_4_ = (auVar172._8_4_ + auVar172._8_4_) * fVar103;
          auVar46._12_4_ = (auVar172._12_4_ + auVar172._12_4_) * fVar103;
          auVar46._16_4_ = fVar103 * 0.0;
          auVar46._20_4_ = fVar103 * 0.0;
          auVar46._24_4_ = fVar103 * 0.0;
          auVar46._28_4_ = 0;
          local_360 = auVar209._0_32_;
          auVar196 = vcmpps_avx(local_360,auVar46,6);
          auVar116 = auVar140 & auVar196;
          auVar197 = ZEXT3264(local_600);
          if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar116 >> 0x7f,0) != '\0') ||
                (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar116 >> 0xbf,0) != '\0') ||
              (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar116[0x1f] < '\0') {
            auVar140 = vandps_avx(auVar196,auVar140);
            auVar138._8_4_ = 0xbf800000;
            auVar138._0_8_ = 0xbf800000bf800000;
            auVar138._12_4_ = 0xbf800000;
            auVar138._16_4_ = 0xbf800000;
            auVar138._20_4_ = 0xbf800000;
            auVar138._24_4_ = 0xbf800000;
            auVar138._28_4_ = 0xbf800000;
            auVar159._8_4_ = 0x40000000;
            auVar159._0_8_ = 0x4000000040000000;
            auVar159._12_4_ = 0x40000000;
            auVar159._16_4_ = 0x40000000;
            auVar159._20_4_ = 0x40000000;
            auVar159._24_4_ = 0x40000000;
            auVar159._28_4_ = 0x40000000;
            auVar172 = vfmadd213ps_fma(local_240,auVar159,auVar138);
            auVar165 = ZEXT1664(auVar172);
            local_240 = ZEXT1632(auVar172);
            auVar196 = local_240;
            local_380 = ZEXT1632(auVar172);
            local_340 = 0;
            local_33c = iVar9;
            local_330 = *(undefined8 *)pPVar1;
            uStack_328 = *(undefined8 *)(pPVar1 + 8);
            local_320 = local_560._0_8_;
            uStack_318 = local_560._8_8_;
            local_310 = local_570._0_8_;
            uStack_308 = local_570._8_8_;
            local_300 = local_580;
            uStack_2f8 = uStack_578;
            local_2e0 = auVar140;
            _local_580 = auVar131;
            local_570 = auVar106;
            local_560 = auVar132;
            if ((pGVar10->mask & (ray->super_RayK<1>).mask) != 0) {
              local_460[0] = auVar140;
              fVar147 = 1.0 / (float)local_3c0._0_4_;
              local_2c0[0] = fVar147 * (auVar215._0_4_ + 0.0);
              local_2c0[1] = fVar147 * (auVar215._4_4_ + 1.0);
              local_2c0[2] = fVar147 * (auVar215._8_4_ + 2.0);
              local_2c0[3] = fVar147 * (auVar215._12_4_ + 3.0);
              fStack_2b0 = fVar147 * (auVar215._16_4_ + 4.0);
              fStack_2ac = fVar147 * (auVar215._20_4_ + 5.0);
              fStack_2a8 = fVar147 * (auVar215._24_4_ + 6.0);
              fStack_2a4 = auVar215._28_4_ + 7.0;
              local_240._0_8_ = auVar172._0_8_;
              local_240._8_8_ = auVar172._8_8_;
              local_2a0 = local_240._0_8_;
              uStack_298 = local_240._8_8_;
              uStack_290 = 0;
              uStack_288 = 0;
              local_280 = local_360;
              auVar139._8_4_ = 0x7f800000;
              auVar139._0_8_ = 0x7f8000007f800000;
              auVar139._12_4_ = 0x7f800000;
              auVar139._16_4_ = 0x7f800000;
              auVar139._20_4_ = 0x7f800000;
              auVar139._24_4_ = 0x7f800000;
              auVar139._28_4_ = 0x7f800000;
              auVar116 = vblendvps_avx(auVar139,local_360,auVar140);
              auVar137 = vshufps_avx(auVar116,auVar116,0xb1);
              auVar137 = vminps_avx(auVar116,auVar137);
              auVar208 = vshufpd_avx(auVar137,auVar137,5);
              auVar137 = vminps_avx(auVar137,auVar208);
              auVar208 = vpermpd_avx2(auVar137,0x4e);
              auVar137 = vminps_avx(auVar137,auVar208);
              auVar116 = vcmpps_avx(auVar116,auVar137,0);
              auVar137 = auVar140 & auVar116;
              if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar137 >> 0x7f,0) != '\0') ||
                    (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar137 >> 0xbf,0) != '\0') ||
                  (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar137[0x1f] < '\0') {
                auVar140 = vandps_avx(auVar116,auVar140);
              }
              uVar93 = vmovmskps_avx(auVar140);
              uVar94 = 0;
              for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                uVar94 = uVar94 + 1;
              }
              auVar98 = (undefined1  [8])(ulong)uVar94;
              local_240 = auVar196;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar147 = local_2c0[(long)auVar98];
                fVar120 = *(float *)((long)&local_2a0 + (long)auVar98 * 4);
                fVar122 = 1.0 - fVar147;
                auVar172 = ZEXT416((uint)(fVar147 * fVar122 * 4.0));
                auVar12 = vfnmsub213ss_fma(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),auVar172);
                auVar172 = vfmadd213ss_fma(ZEXT416((uint)fVar122),ZEXT416((uint)fVar122),auVar172);
                fVar122 = fVar122 * -fVar122 * 0.5;
                fVar124 = auVar12._0_4_ * 0.5;
                fVar229 = auVar172._0_4_ * 0.5;
                fVar230 = fVar147 * fVar147 * 0.5;
                auVar170._0_4_ = fVar230 * (float)local_580._0_4_;
                auVar170._4_4_ = fVar230 * (float)local_580._4_4_;
                auVar170._8_4_ = fVar230 * (float)uStack_578;
                auVar170._12_4_ = fVar230 * uStack_578._4_4_;
                auVar150._4_4_ = fVar229;
                auVar150._0_4_ = fVar229;
                auVar150._8_4_ = fVar229;
                auVar150._12_4_ = fVar229;
                auVar172 = vfmadd132ps_fma(auVar150,auVar170,local_570);
                auVar171._4_4_ = fVar124;
                auVar171._0_4_ = fVar124;
                auVar171._8_4_ = fVar124;
                auVar171._12_4_ = fVar124;
                auVar172 = vfmadd132ps_fma(auVar171,auVar172,local_560);
                auVar151._4_4_ = fVar122;
                auVar151._0_4_ = fVar122;
                auVar151._8_4_ = fVar122;
                auVar151._12_4_ = fVar122;
                auVar172 = vfmadd132ps_fma(auVar151,auVar172,*(undefined1 (*) [16])pPVar1);
                auVar165 = ZEXT464((uint)*(float *)(local_280 + (long)auVar98 * 4));
                (ray->super_RayK<1>).tfar = *(float *)(local_280 + (long)auVar98 * 4);
                uVar104 = vmovlps_avx(auVar172);
                *(undefined8 *)&(ray->Ng).field_0 = uVar104;
                fVar122 = (float)vextractps_avx(auVar172,2);
                (ray->Ng).field_0.field_0.z = fVar122;
                ray->u = fVar147;
                ray->v = fVar120;
                ray->primID = uVar96;
                ray->geomID = uVar8;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_640 = ZEXT1632(local_560);
                auStack_490 = local_4a0._16_16_;
                _local_4a0 = local_570;
                _local_480 = ZEXT1632(_local_580);
                local_660 = local_3a0;
                local_6a0 = local_360;
                local_730 = pPVar99;
                local_738 = context;
                local_740 = ray;
                local_748 = pre;
                do {
                  local_544 = local_2c0[(long)auVar98];
                  local_540 = *(undefined4 *)((long)&local_2a0 + (long)auVar98 * 4);
                  local_720._0_4_ = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_280 + (long)auVar98 * 4);
                  local_6d0.context = context->user;
                  fVar147 = 1.0 - local_544;
                  auVar172 = ZEXT416((uint)(local_544 * fVar147 * 4.0));
                  auVar12 = vfnmsub213ss_fma(ZEXT416((uint)local_544),ZEXT416((uint)local_544),
                                             auVar172);
                  auVar172 = vfmadd213ss_fma(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),auVar172)
                  ;
                  fVar147 = fVar147 * -fVar147 * 0.5;
                  auVar165 = ZEXT464((uint)fVar147);
                  fVar120 = auVar12._0_4_ * 0.5;
                  fVar122 = auVar172._0_4_ * 0.5;
                  fVar124 = local_544 * local_544 * 0.5;
                  auVar177._0_4_ = fVar124 * (float)local_480._0_4_;
                  auVar177._4_4_ = fVar124 * (float)local_480._4_4_;
                  auVar177._8_4_ = fVar124 * fStack_478;
                  auVar177._12_4_ = fVar124 * fStack_474;
                  auVar156._4_4_ = fVar122;
                  auVar156._0_4_ = fVar122;
                  auVar156._8_4_ = fVar122;
                  auVar156._12_4_ = fVar122;
                  auVar172 = vfmadd132ps_fma(auVar156,auVar177,_local_4a0);
                  auVar178._4_4_ = fVar120;
                  auVar178._0_4_ = fVar120;
                  auVar178._8_4_ = fVar120;
                  auVar178._12_4_ = fVar120;
                  auVar172 = vfmadd132ps_fma(auVar178,auVar172,local_640._0_16_);
                  auVar157._4_4_ = fVar147;
                  auVar157._0_4_ = fVar147;
                  auVar157._8_4_ = fVar147;
                  auVar157._12_4_ = fVar147;
                  auVar89._8_8_ = uStack_6d8;
                  auVar89._0_8_ = local_6e0;
                  auVar172 = vfmadd132ps_fma(auVar157,auVar172,auVar89);
                  local_550 = vmovlps_avx(auVar172);
                  local_548 = vextractps_avx(auVar172,2);
                  local_53c = uVar96;
                  local_538 = (int)local_728;
                  local_534 = (local_6d0.context)->instID[0];
                  local_530 = (local_6d0.context)->instPrimID[0];
                  local_784 = -1;
                  local_6d0.valid = &local_784;
                  local_6d0.geometryUserPtr = pGVar10->userPtr;
                  local_6d0.ray = (RTCRayN *)ray;
                  local_6d0.hit = (RTCHitN *)&local_550;
                  local_6d0.N = 1;
                  local_780 = auVar98;
                  if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0166f935:
                    p_Var11 = context->args->filter;
                    if (p_Var11 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar10->field_8).field_0x2 & 0x40) != 0)) {
                        auVar165 = ZEXT1664(auVar165._0_16_);
                        (*p_Var11)(&local_6d0);
                        auVar224 = ZEXT3264(_local_5c0);
                        auVar145 = ZEXT3264(local_520);
                        auVar197 = ZEXT3264(local_600);
                        auVar192 = ZEXT3264(local_680);
                        auVar209 = ZEXT3264(local_6a0);
                        auVar215 = ZEXT3264(local_660);
                        auVar98 = local_780;
                        pre = local_748;
                        pPVar99 = local_730;
                        context = local_738;
                        ray = local_740;
                      }
                      if (*local_6d0.valid == 0) goto LAB_0166fa32;
                    }
                    (((Vec3f *)((long)local_6d0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_6d0.hit;
                    (((Vec3f *)((long)local_6d0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_6d0.hit + 4);
                    (((Vec3f *)((long)local_6d0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_6d0.hit + 8);
                    *(float *)((long)local_6d0.ray + 0x3c) = *(float *)(local_6d0.hit + 0xc);
                    *(float *)((long)local_6d0.ray + 0x40) = *(float *)(local_6d0.hit + 0x10);
                    *(float *)((long)local_6d0.ray + 0x44) = *(float *)(local_6d0.hit + 0x14);
                    *(float *)((long)local_6d0.ray + 0x48) = *(float *)(local_6d0.hit + 0x18);
                    *(float *)((long)local_6d0.ray + 0x4c) = *(float *)(local_6d0.hit + 0x1c);
                    *(float *)((long)local_6d0.ray + 0x50) = *(float *)(local_6d0.hit + 0x20);
                    auVar98 = local_780;
                  }
                  else {
                    auVar165 = ZEXT464((uint)fVar147);
                    (*pGVar10->intersectionFilterN)(&local_6d0);
                    auVar224 = ZEXT3264(_local_5c0);
                    auVar145 = ZEXT3264(local_520);
                    auVar197 = ZEXT3264(local_600);
                    auVar192 = ZEXT3264(local_680);
                    auVar209 = ZEXT3264(local_6a0);
                    auVar215 = ZEXT3264(local_660);
                    auVar98 = local_780;
                    pre = local_748;
                    pPVar99 = local_730;
                    context = local_738;
                    ray = local_740;
                    if (*local_6d0.valid != 0) goto LAB_0166f935;
LAB_0166fa32:
                    (ray->super_RayK<1>).tfar = (float)local_720._0_4_;
                  }
                  auVar163 = auVar145._0_32_;
                  auVar190 = auVar192._0_32_;
                  *(undefined4 *)(local_460[0] + (long)auVar98 * 4) = 0;
                  auVar116 = local_460[0];
                  fVar147 = (ray->super_RayK<1>).tfar;
                  auVar119._4_4_ = fVar147;
                  auVar119._0_4_ = fVar147;
                  auVar119._8_4_ = fVar147;
                  auVar119._12_4_ = fVar147;
                  auVar119._16_4_ = fVar147;
                  auVar119._20_4_ = fVar147;
                  auVar119._24_4_ = fVar147;
                  auVar119._28_4_ = fVar147;
                  auVar196 = vcmpps_avx(auVar209._0_32_,auVar119,2);
                  auVar140 = vandps_avx(auVar196,local_460[0]);
                  local_460[0] = auVar140;
                  auVar116 = auVar116 & auVar196;
                  bVar85 = (auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar86 = (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar84 = (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar83 = SUB321(auVar116 >> 0x7f,0) != '\0';
                  bVar82 = (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar81 = SUB321(auVar116 >> 0xbf,0) != '\0';
                  bVar79 = (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar78 = auVar116[0x1f] < '\0';
                  if (((((((bVar85 || bVar86) || bVar84) || bVar83) || bVar82) || bVar81) || bVar79)
                      || bVar78) {
                    auVar144._8_4_ = 0x7f800000;
                    auVar144._0_8_ = 0x7f8000007f800000;
                    auVar144._12_4_ = 0x7f800000;
                    auVar144._16_4_ = 0x7f800000;
                    auVar144._20_4_ = 0x7f800000;
                    auVar144._24_4_ = 0x7f800000;
                    auVar144._28_4_ = 0x7f800000;
                    auVar196 = vblendvps_avx(auVar144,auVar209._0_32_,auVar140);
                    auVar116 = vshufps_avx(auVar196,auVar196,0xb1);
                    auVar116 = vminps_avx(auVar196,auVar116);
                    auVar137 = vshufpd_avx(auVar116,auVar116,5);
                    auVar116 = vminps_avx(auVar116,auVar137);
                    auVar137 = vpermpd_avx2(auVar116,0x4e);
                    auVar165 = ZEXT3264(auVar137);
                    auVar116 = vminps_avx(auVar116,auVar137);
                    auVar196 = vcmpps_avx(auVar196,auVar116,0);
                    auVar116 = auVar140 & auVar196;
                    if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar116 >> 0x7f,0) != '\0') ||
                          (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar116 >> 0xbf,0) != '\0') ||
                        (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar116[0x1f] < '\0') {
                      auVar140 = vandps_avx(auVar196,auVar140);
                    }
                    uVar94 = vmovmskps_avx(auVar140);
                    uVar8 = 0;
                    for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                      uVar8 = uVar8 + 1;
                    }
                    auVar98 = (undefined1  [8])(ulong)uVar8;
                  }
                } while (((((((bVar85 || bVar86) || bVar84) || bVar83) || bVar82) || bVar81) ||
                         bVar79) || bVar78);
              }
              fVar147 = (float)local_700._0_4_;
            }
            auVar192 = ZEXT3264(local_5e0);
            auVar145 = ZEXT3264(local_4e0);
            auVar202 = ZEXT3264(auVar190);
            fVar161 = (float)local_620;
            fVar166 = local_620._4_4_;
            fVar120 = (float)uStack_618;
            fVar122 = uStack_618._4_4_;
            fVar124 = (float)uStack_610;
            fVar229 = uStack_610._4_4_;
            fVar230 = (float)uStack_608;
            goto LAB_0166e432;
          }
        }
        auVar197 = ZEXT3264(local_600);
        auVar192 = ZEXT3264(local_5e0);
        auVar145 = ZEXT3264(local_4e0);
        auVar202 = ZEXT3264(auVar190);
      }
LAB_0166e432:
      if (8 < iVar9) {
        _local_5c0 = auVar224._0_32_;
        local_520 = auVar163;
        local_200._4_4_ = iVar9;
        local_200._0_4_ = iVar9;
        local_200._8_4_ = iVar9;
        local_200._12_4_ = iVar9;
        local_200._16_4_ = iVar9;
        local_200._20_4_ = iVar9;
        local_200._24_4_ = iVar9;
        local_200._28_4_ = iVar9;
        local_140 = fVar147;
        fStack_13c = fVar147;
        fStack_138 = fVar147;
        fStack_134 = fVar147;
        fStack_130 = fVar147;
        fStack_12c = fVar147;
        fStack_128 = fVar147;
        fStack_124 = fVar147;
        local_160 = local_500._0_4_;
        uStack_15c = local_500._0_4_;
        uStack_158 = local_500._0_4_;
        uStack_154 = local_500._0_4_;
        uStack_150 = local_500._0_4_;
        uStack_14c = local_500._0_4_;
        uStack_148 = local_500._0_4_;
        uStack_144 = local_500._0_4_;
        local_3c0._4_4_ = 1.0 / (float)local_3c0._0_4_;
        local_3c0._0_4_ = local_3c0._4_4_;
        fStack_3b8 = (float)local_3c0._4_4_;
        fStack_3b4 = (float)local_3c0._4_4_;
        fStack_3b0 = (float)local_3c0._4_4_;
        fStack_3ac = (float)local_3c0._4_4_;
        fStack_3a8 = (float)local_3c0._4_4_;
        fStack_3a4 = (float)local_3c0._4_4_;
        lVar101 = 8;
        local_660 = auVar215._0_32_;
        local_6a0 = auVar209._0_32_;
        fVar147 = local_5a0;
        fVar103 = fStack_59c;
        fVar121 = fStack_598;
        fVar123 = fStack_594;
        fVar125 = fStack_590;
        fVar126 = fStack_58c;
        fVar127 = fStack_588;
        fVar128 = fStack_584;
        do {
          auVar140 = *(undefined1 (*) [32])(bspline_basis0 + lVar101 * 4 + lVar22);
          auVar196 = *(undefined1 (*) [32])(lVar22 + 0x222bfac + lVar101 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar22 + 0x222c430 + lVar101 * 4);
          pauVar2 = (undefined1 (*) [28])(lVar22 + 0x222c8b4 + lVar101 * 4);
          auVar92 = *pauVar2;
          auVar225._0_4_ = fVar147 * *(float *)*pauVar2;
          auVar225._4_4_ = fVar103 * *(float *)(*pauVar2 + 4);
          auVar225._8_4_ = fVar121 * *(float *)(*pauVar2 + 8);
          auVar225._12_4_ = fVar123 * *(float *)(*pauVar2 + 0xc);
          auVar225._16_4_ = fVar125 * *(float *)(*pauVar2 + 0x10);
          auVar225._20_4_ = fVar126 * *(float *)(*pauVar2 + 0x14);
          auVar225._28_36_ = auVar224._28_36_;
          auVar225._24_4_ = fVar127 * *(float *)(*pauVar2 + 0x18);
          auVar224._0_4_ = fVar161 * *(float *)*pauVar2;
          auVar224._4_4_ = fVar166 * *(float *)(*pauVar2 + 4);
          auVar224._8_4_ = fVar120 * *(float *)(*pauVar2 + 8);
          auVar224._12_4_ = fVar122 * *(float *)(*pauVar2 + 0xc);
          auVar224._16_4_ = fVar124 * *(float *)(*pauVar2 + 0x10);
          auVar224._20_4_ = fVar229 * *(float *)(*pauVar2 + 0x14);
          auVar224._28_36_ = auVar165._28_36_;
          auVar224._24_4_ = fVar230 * *(float *)(*pauVar2 + 0x18);
          auVar172 = vfmadd231ps_fma(auVar225._0_32_,auVar116,local_4c0);
          auVar12 = vfmadd231ps_fma(auVar224._0_32_,auVar116,auVar202._0_32_);
          auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),auVar196,auVar197._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar196,auVar145._0_32_);
          auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),auVar140,auVar192._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar140,local_420);
          auVar137 = *(undefined1 (*) [32])(bspline_basis1 + lVar101 * 4 + lVar22);
          auVar208 = *(undefined1 (*) [32])(lVar22 + 0x222e3cc + lVar101 * 4);
          auVar200 = *(undefined1 (*) [32])(lVar22 + 0x222e850 + lVar101 * 4);
          pfVar3 = (float *)(lVar22 + 0x222ecd4 + lVar101 * 4);
          fVar148 = *pfVar3;
          fVar129 = pfVar3[1];
          fVar146 = pfVar3[2];
          fVar210 = pfVar3[3];
          fVar211 = pfVar3[4];
          fVar212 = pfVar3[5];
          fVar213 = pfVar3[6];
          auVar47._4_4_ = fVar103 * fVar129;
          auVar47._0_4_ = fVar147 * fVar148;
          auVar47._8_4_ = fVar121 * fVar146;
          auVar47._12_4_ = fVar123 * fVar210;
          auVar47._16_4_ = fVar125 * fVar211;
          auVar47._20_4_ = fVar126 * fVar212;
          auVar47._24_4_ = fVar127 * fVar213;
          auVar47._28_4_ = fVar128;
          auVar165._0_4_ = fVar161 * fVar148;
          auVar165._4_4_ = fVar166 * fVar129;
          auVar165._8_4_ = fVar120 * fVar146;
          auVar165._12_4_ = fVar122 * fVar210;
          auVar165._16_4_ = fVar124 * fVar211;
          auVar165._20_4_ = fVar229 * fVar212;
          auVar165._28_36_ = auVar192._28_36_;
          auVar165._24_4_ = fVar230 * fVar213;
          auVar13 = vfmadd231ps_fma(auVar47,auVar200,local_4c0);
          auVar14 = vfmadd231ps_fma(auVar165._0_32_,auVar200,auVar202._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar208,auVar197._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar208,auVar145._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar137,auVar192._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar137,local_420);
          _local_480 = ZEXT1632(auVar13);
          local_1e0 = ZEXT1632(auVar172);
          auVar110 = vsubps_avx(_local_480,local_1e0);
          local_1c0 = ZEXT1632(auVar14);
          _local_4a0 = ZEXT1632(auVar12);
          local_1a0 = vsubps_avx(local_1c0,_local_4a0);
          auVar48._4_4_ = auVar12._4_4_ * auVar110._4_4_;
          auVar48._0_4_ = auVar12._0_4_ * auVar110._0_4_;
          auVar48._8_4_ = auVar12._8_4_ * auVar110._8_4_;
          auVar48._12_4_ = auVar12._12_4_ * auVar110._12_4_;
          auVar48._16_4_ = auVar110._16_4_ * 0.0;
          auVar48._20_4_ = auVar110._20_4_ * 0.0;
          auVar48._24_4_ = auVar110._24_4_ * 0.0;
          auVar48._28_4_ = auVar137._28_4_;
          fVar147 = local_1a0._0_4_;
          auVar209._0_4_ = auVar172._0_4_ * fVar147;
          fVar120 = local_1a0._4_4_;
          auVar209._4_4_ = auVar172._4_4_ * fVar120;
          fVar122 = local_1a0._8_4_;
          auVar209._8_4_ = auVar172._8_4_ * fVar122;
          fVar124 = local_1a0._12_4_;
          auVar209._12_4_ = auVar172._12_4_ * fVar124;
          fVar229 = local_1a0._16_4_;
          auVar209._16_4_ = fVar229 * 0.0;
          fVar230 = local_1a0._20_4_;
          auVar209._20_4_ = fVar230 * 0.0;
          fVar103 = local_1a0._24_4_;
          auVar209._28_36_ = auVar145._28_36_;
          auVar209._24_4_ = fVar103 * 0.0;
          auVar224 = ZEXT3264(auVar116);
          auVar17 = vsubps_avx(auVar48,auVar209._0_32_);
          local_780._0_4_ = auVar92._0_4_;
          local_780._4_4_ = auVar92._4_4_;
          fStack_778 = auVar92._8_4_;
          fStack_774 = auVar92._12_4_;
          fStack_770 = auVar92._16_4_;
          fStack_76c = auVar92._20_4_;
          fStack_768 = auVar92._24_4_;
          auVar49._4_4_ = local_e0._4_4_ * (float)local_780._4_4_;
          auVar49._0_4_ = (float)local_e0 * (float)local_780._0_4_;
          auVar49._8_4_ = (float)uStack_d8 * fStack_778;
          auVar49._12_4_ = uStack_d8._4_4_ * fStack_774;
          auVar49._16_4_ = (float)uStack_d0 * fStack_770;
          auVar49._20_4_ = uStack_d0._4_4_ * fStack_76c;
          auVar49._24_4_ = (float)uStack_c8 * fStack_768;
          auVar49._28_4_ = local_4c0._28_4_;
          auVar172 = vfmadd231ps_fma(auVar49,auVar116,local_c0);
          auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),auVar196,local_a0);
          auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),local_80,auVar140);
          auVar50._4_4_ = local_e0._4_4_ * fVar129;
          auVar50._0_4_ = (float)local_e0 * fVar148;
          auVar50._8_4_ = (float)uStack_d8 * fVar146;
          auVar50._12_4_ = uStack_d8._4_4_ * fVar210;
          auVar50._16_4_ = (float)uStack_d0 * fVar211;
          auVar50._20_4_ = uStack_d0._4_4_ * fVar212;
          auVar50._24_4_ = (float)uStack_c8 * fVar213;
          auVar50._28_4_ = uStack_c8._4_4_;
          auVar12 = vfmadd231ps_fma(auVar50,auVar200,local_c0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar208,local_a0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar137,local_80);
          auVar51._4_4_ = fVar120 * fVar120;
          auVar51._0_4_ = fVar147 * fVar147;
          auVar51._8_4_ = fVar122 * fVar122;
          auVar51._12_4_ = fVar124 * fVar124;
          auVar51._16_4_ = fVar229 * fVar229;
          auVar51._20_4_ = fVar230 * fVar230;
          auVar51._24_4_ = fVar103 * fVar103;
          auVar51._28_4_ = local_80._28_4_;
          auVar13 = vfmadd231ps_fma(auVar51,auVar110,auVar110);
          auVar117 = vmaxps_avx(ZEXT1632(auVar172),ZEXT1632(auVar12));
          auVar205._0_4_ = auVar117._0_4_ * auVar117._0_4_ * auVar13._0_4_;
          auVar205._4_4_ = auVar117._4_4_ * auVar117._4_4_ * auVar13._4_4_;
          auVar205._8_4_ = auVar117._8_4_ * auVar117._8_4_ * auVar13._8_4_;
          auVar205._12_4_ = auVar117._12_4_ * auVar117._12_4_ * auVar13._12_4_;
          auVar205._16_4_ = auVar117._16_4_ * auVar117._16_4_ * 0.0;
          auVar205._20_4_ = auVar117._20_4_ * auVar117._20_4_ * 0.0;
          auVar205._24_4_ = auVar117._24_4_ * auVar117._24_4_ * 0.0;
          auVar205._28_4_ = 0;
          auVar52._4_4_ = auVar17._4_4_ * auVar17._4_4_;
          auVar52._0_4_ = auVar17._0_4_ * auVar17._0_4_;
          auVar52._8_4_ = auVar17._8_4_ * auVar17._8_4_;
          auVar52._12_4_ = auVar17._12_4_ * auVar17._12_4_;
          auVar52._16_4_ = auVar17._16_4_ * auVar17._16_4_;
          auVar52._20_4_ = auVar17._20_4_ * auVar17._20_4_;
          auVar52._24_4_ = auVar17._24_4_ * auVar17._24_4_;
          auVar52._28_4_ = auVar17._28_4_;
          auVar117 = vcmpps_avx(auVar52,auVar205,2);
          auVar165 = ZEXT3264(auVar117);
          local_340 = (int)lVar101;
          auVar206._4_4_ = local_340;
          auVar206._0_4_ = local_340;
          auVar206._8_4_ = local_340;
          auVar206._12_4_ = local_340;
          auVar206._16_4_ = local_340;
          auVar206._20_4_ = local_340;
          auVar206._24_4_ = local_340;
          auVar206._28_4_ = local_340;
          auVar17 = vpor_avx2(auVar206,_DAT_0205a920);
          auVar21 = vpcmpgtd_avx2(local_200,auVar17);
          auVar17 = auVar21 & auVar117;
          fVar147 = local_5a0;
          fVar103 = fStack_59c;
          fVar121 = fStack_598;
          fVar123 = fStack_594;
          fVar125 = fStack_590;
          fVar126 = fStack_58c;
          fVar127 = fStack_588;
          fVar128 = fStack_584;
          fVar161 = (float)local_620;
          fVar166 = local_620._4_4_;
          fVar120 = (float)uStack_618;
          fVar122 = uStack_618._4_4_;
          fVar124 = (float)uStack_610;
          fVar229 = uStack_610._4_4_;
          fVar230 = (float)uStack_608;
          if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar17 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar17 >> 0x7f,0) == '\0') &&
                (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar17 >> 0xbf,0) == '\0') &&
              (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar17[0x1f]) {
LAB_0166ef71:
            auVar209 = ZEXT3264(local_6a0);
            auVar202 = ZEXT3264(local_680);
            auVar145 = ZEXT3264(local_4e0);
            auVar197 = ZEXT3264(local_600);
            auVar192 = ZEXT3264(local_5e0);
          }
          else {
            local_220 = vandps_avx(auVar21,auVar117);
            auVar53._4_4_ = (float)local_5c0._4_4_ * fVar129;
            auVar53._0_4_ = (float)local_5c0._0_4_ * fVar148;
            auVar53._8_4_ = fStack_5b8 * fVar146;
            auVar53._12_4_ = fStack_5b4 * fVar210;
            auVar53._16_4_ = fStack_5b0 * fVar211;
            auVar53._20_4_ = fStack_5ac * fVar212;
            auVar53._24_4_ = fStack_5a8 * fVar213;
            auVar53._28_4_ = auVar117._28_4_;
            auVar13 = vfmadd213ps_fma(auVar200,local_400,auVar53);
            auVar13 = vfmadd213ps_fma(auVar208,local_100,ZEXT1632(auVar13));
            auVar13 = vfmadd132ps_fma(auVar137,ZEXT1632(auVar13),local_520);
            auVar54._4_4_ = (float)local_5c0._4_4_ * (float)local_780._4_4_;
            auVar54._0_4_ = (float)local_5c0._0_4_ * (float)local_780._0_4_;
            auVar54._8_4_ = fStack_5b8 * fStack_778;
            auVar54._12_4_ = fStack_5b4 * fStack_774;
            auVar54._16_4_ = fStack_5b0 * fStack_770;
            auVar54._20_4_ = fStack_5ac * fStack_76c;
            auVar54._24_4_ = fStack_5a8 * fStack_768;
            auVar54._28_4_ = auVar117._28_4_;
            auVar14 = vfmadd213ps_fma(auVar116,local_400,auVar54);
            auVar14 = vfmadd213ps_fma(auVar196,local_100,ZEXT1632(auVar14));
            auVar196 = *(undefined1 (*) [32])(lVar22 + 0x222cd38 + lVar101 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar22 + 0x222d1bc + lVar101 * 4);
            auVar137 = *(undefined1 (*) [32])(lVar22 + 0x222d640 + lVar101 * 4);
            pfVar3 = (float *)(lVar22 + 0x222dac4 + lVar101 * 4);
            fVar148 = *pfVar3;
            fVar129 = pfVar3[1];
            fVar146 = pfVar3[2];
            fVar210 = pfVar3[3];
            fVar211 = pfVar3[4];
            fVar212 = pfVar3[5];
            fVar213 = pfVar3[6];
            auVar201._0_4_ = local_5a0 * fVar148;
            auVar201._4_4_ = fStack_59c * fVar129;
            auVar201._8_4_ = fStack_598 * fVar146;
            auVar201._12_4_ = fStack_594 * fVar210;
            auVar201._16_4_ = fStack_590 * fVar211;
            auVar201._20_4_ = fStack_58c * fVar212;
            auVar201._24_4_ = fStack_588 * fVar213;
            auVar201._28_4_ = 0;
            auVar222._0_4_ = (float)local_620 * fVar148;
            auVar222._4_4_ = local_620._4_4_ * fVar129;
            auVar222._8_4_ = (float)uStack_618 * fVar146;
            auVar222._12_4_ = uStack_618._4_4_ * fVar210;
            auVar222._16_4_ = (float)uStack_610 * fVar211;
            auVar222._20_4_ = uStack_610._4_4_ * fVar212;
            auVar222._24_4_ = (float)uStack_608 * fVar213;
            auVar222._28_4_ = 0;
            auVar55._4_4_ = fVar129 * (float)local_5c0._4_4_;
            auVar55._0_4_ = fVar148 * (float)local_5c0._0_4_;
            auVar55._8_4_ = fVar146 * fStack_5b8;
            auVar55._12_4_ = fVar210 * fStack_5b4;
            auVar55._16_4_ = fVar211 * fStack_5b0;
            auVar55._20_4_ = fVar212 * fStack_5ac;
            auVar55._24_4_ = fVar213 * fStack_5a8;
            auVar55._28_4_ = pfVar3[7];
            auVar15 = vfmadd231ps_fma(auVar201,auVar137,local_4c0);
            auVar16 = vfmadd231ps_fma(auVar222,auVar137,local_680);
            auVar108 = vfmadd231ps_fma(auVar55,local_400,auVar137);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar116,local_600);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar116,local_4e0);
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),local_100,auVar116);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar196,local_5e0);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar196,local_420);
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar196,local_520);
            pfVar3 = (float *)(lVar22 + 0x222fee4 + lVar101 * 4);
            fVar148 = *pfVar3;
            fVar129 = pfVar3[1];
            fVar146 = pfVar3[2];
            fVar210 = pfVar3[3];
            fVar211 = pfVar3[4];
            fVar212 = pfVar3[5];
            fVar213 = pfVar3[6];
            auVar56._4_4_ = fStack_59c * fVar129;
            auVar56._0_4_ = local_5a0 * fVar148;
            auVar56._8_4_ = fStack_598 * fVar146;
            auVar56._12_4_ = fStack_594 * fVar210;
            auVar56._16_4_ = fStack_590 * fVar211;
            auVar56._20_4_ = fStack_58c * fVar212;
            auVar56._24_4_ = fStack_588 * fVar213;
            auVar56._28_4_ = fStack_584;
            auVar57._4_4_ = local_620._4_4_ * fVar129;
            auVar57._0_4_ = (float)local_620 * fVar148;
            auVar57._8_4_ = (float)uStack_618 * fVar146;
            auVar57._12_4_ = uStack_618._4_4_ * fVar210;
            auVar57._16_4_ = (float)uStack_610 * fVar211;
            auVar57._20_4_ = uStack_610._4_4_ * fVar212;
            auVar57._24_4_ = (float)uStack_608 * fVar213;
            auVar57._28_4_ = uStack_608._4_4_;
            auVar58._4_4_ = fVar129 * (float)local_5c0._4_4_;
            auVar58._0_4_ = fVar148 * (float)local_5c0._0_4_;
            auVar58._8_4_ = fVar146 * fStack_5b8;
            auVar58._12_4_ = fVar210 * fStack_5b4;
            auVar58._16_4_ = fVar211 * fStack_5b0;
            auVar58._20_4_ = fVar212 * fStack_5ac;
            auVar58._24_4_ = fVar213 * fStack_5a8;
            auVar58._28_4_ = pfVar3[7];
            auVar196 = *(undefined1 (*) [32])(lVar22 + 0x222fa60 + lVar101 * 4);
            auVar107 = vfmadd231ps_fma(auVar56,auVar196,local_4c0);
            auVar149 = vfmadd231ps_fma(auVar57,auVar196,local_680);
            auVar131 = vfmadd231ps_fma(auVar58,local_400,auVar196);
            auVar196 = *(undefined1 (*) [32])(lVar22 + 0x222f5dc + lVar101 * 4);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar196,local_600);
            auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar196,local_4e0);
            auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),local_100,auVar196);
            auVar196 = *(undefined1 (*) [32])(lVar22 + 0x222f158 + lVar101 * 4);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar196,local_5e0);
            auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar196,local_420);
            auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),local_520,auVar196);
            auVar207._8_4_ = 0x7fffffff;
            auVar207._0_8_ = 0x7fffffff7fffffff;
            auVar207._12_4_ = 0x7fffffff;
            auVar207._16_4_ = 0x7fffffff;
            auVar207._20_4_ = 0x7fffffff;
            auVar207._24_4_ = 0x7fffffff;
            auVar207._28_4_ = 0x7fffffff;
            auVar196 = vandps_avx(ZEXT1632(auVar15),auVar207);
            auVar116 = vandps_avx(ZEXT1632(auVar16),auVar207);
            auVar116 = vmaxps_avx(auVar196,auVar116);
            auVar196 = vandps_avx(ZEXT1632(auVar108),auVar207);
            auVar196 = vmaxps_avx(auVar116,auVar196);
            auVar91._4_4_ = fStack_13c;
            auVar91._0_4_ = local_140;
            auVar91._8_4_ = fStack_138;
            auVar91._12_4_ = fStack_134;
            auVar91._16_4_ = fStack_130;
            auVar91._20_4_ = fStack_12c;
            auVar91._24_4_ = fStack_128;
            auVar91._28_4_ = fStack_124;
            auVar196 = vcmpps_avx(auVar196,auVar91,1);
            auVar137 = vblendvps_avx(ZEXT1632(auVar15),auVar110,auVar196);
            auVar208 = vblendvps_avx(ZEXT1632(auVar16),local_1a0,auVar196);
            auVar196 = vandps_avx(ZEXT1632(auVar107),auVar207);
            auVar116 = vandps_avx(ZEXT1632(auVar149),auVar207);
            auVar116 = vmaxps_avx(auVar196,auVar116);
            auVar196 = vandps_avx(auVar207,ZEXT1632(auVar131));
            auVar196 = vmaxps_avx(auVar116,auVar196);
            auVar116 = vcmpps_avx(auVar196,auVar91,1);
            auVar196 = vblendvps_avx(ZEXT1632(auVar107),auVar110,auVar116);
            auVar116 = vblendvps_avx(ZEXT1632(auVar149),local_1a0,auVar116);
            auVar14 = vfmadd213ps_fma(auVar140,local_520,ZEXT1632(auVar14));
            auVar15 = vfmadd213ps_fma(auVar137,auVar137,ZEXT832(0) << 0x20);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar208,auVar208);
            auVar140 = vrsqrtps_avx(ZEXT1632(auVar15));
            fVar148 = auVar140._0_4_;
            fVar129 = auVar140._4_4_;
            fVar146 = auVar140._8_4_;
            fVar210 = auVar140._12_4_;
            fVar211 = auVar140._16_4_;
            fVar212 = auVar140._20_4_;
            fVar213 = auVar140._24_4_;
            auVar59._4_4_ = fVar129 * fVar129 * fVar129 * auVar15._4_4_ * -0.5;
            auVar59._0_4_ = fVar148 * fVar148 * fVar148 * auVar15._0_4_ * -0.5;
            auVar59._8_4_ = fVar146 * fVar146 * fVar146 * auVar15._8_4_ * -0.5;
            auVar59._12_4_ = fVar210 * fVar210 * fVar210 * auVar15._12_4_ * -0.5;
            auVar59._16_4_ = fVar211 * fVar211 * fVar211 * -0.0;
            auVar59._20_4_ = fVar212 * fVar212 * fVar212 * -0.0;
            auVar59._24_4_ = fVar213 * fVar213 * fVar213 * -0.0;
            auVar59._28_4_ = 0;
            auVar228._8_4_ = 0x3fc00000;
            auVar228._0_8_ = 0x3fc000003fc00000;
            auVar228._12_4_ = 0x3fc00000;
            auVar228._16_4_ = 0x3fc00000;
            auVar228._20_4_ = 0x3fc00000;
            auVar228._24_4_ = 0x3fc00000;
            auVar228._28_4_ = 0x3fc00000;
            auVar15 = vfmadd231ps_fma(auVar59,auVar228,auVar140);
            fVar148 = auVar15._0_4_;
            fVar129 = auVar15._4_4_;
            auVar60._4_4_ = auVar208._4_4_ * fVar129;
            auVar60._0_4_ = auVar208._0_4_ * fVar148;
            fVar146 = auVar15._8_4_;
            auVar60._8_4_ = auVar208._8_4_ * fVar146;
            fVar210 = auVar15._12_4_;
            auVar60._12_4_ = auVar208._12_4_ * fVar210;
            auVar60._16_4_ = auVar208._16_4_ * 0.0;
            auVar60._20_4_ = auVar208._20_4_ * 0.0;
            auVar60._24_4_ = auVar208._24_4_ * 0.0;
            auVar60._28_4_ = auVar140._28_4_;
            auVar61._4_4_ = fVar129 * -auVar137._4_4_;
            auVar61._0_4_ = fVar148 * -auVar137._0_4_;
            auVar61._8_4_ = fVar146 * -auVar137._8_4_;
            auVar61._12_4_ = fVar210 * -auVar137._12_4_;
            auVar61._16_4_ = -auVar137._16_4_ * 0.0;
            auVar61._20_4_ = -auVar137._20_4_ * 0.0;
            auVar61._24_4_ = -auVar137._24_4_ * 0.0;
            auVar61._28_4_ = auVar208._28_4_;
            auVar15 = vfmadd213ps_fma(auVar196,auVar196,ZEXT832(0) << 0x20);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar116,auVar116);
            auVar140 = vrsqrtps_avx(ZEXT1632(auVar15));
            auVar62._28_4_ = local_1a0._28_4_;
            auVar62._0_28_ =
                 ZEXT1628(CONCAT412(fVar210 * 0.0,
                                    CONCAT48(fVar146 * 0.0,CONCAT44(fVar129 * 0.0,fVar148 * 0.0))));
            fVar148 = auVar140._0_4_;
            fVar129 = auVar140._4_4_;
            fVar146 = auVar140._8_4_;
            fVar210 = auVar140._12_4_;
            fVar211 = auVar140._16_4_;
            fVar212 = auVar140._20_4_;
            fVar213 = auVar140._24_4_;
            auVar63._4_4_ = fVar129 * fVar129 * fVar129 * auVar15._4_4_ * -0.5;
            auVar63._0_4_ = fVar148 * fVar148 * fVar148 * auVar15._0_4_ * -0.5;
            auVar63._8_4_ = fVar146 * fVar146 * fVar146 * auVar15._8_4_ * -0.5;
            auVar63._12_4_ = fVar210 * fVar210 * fVar210 * auVar15._12_4_ * -0.5;
            auVar63._16_4_ = fVar211 * fVar211 * fVar211 * -0.0;
            auVar63._20_4_ = fVar212 * fVar212 * fVar212 * -0.0;
            auVar63._24_4_ = fVar213 * fVar213 * fVar213 * -0.0;
            auVar63._28_4_ = 0;
            auVar15 = vfmadd231ps_fma(auVar63,auVar228,auVar140);
            fVar148 = auVar15._0_4_;
            fVar129 = auVar15._4_4_;
            auVar64._4_4_ = auVar116._4_4_ * fVar129;
            auVar64._0_4_ = auVar116._0_4_ * fVar148;
            fVar146 = auVar15._8_4_;
            auVar64._8_4_ = auVar116._8_4_ * fVar146;
            fVar210 = auVar15._12_4_;
            auVar64._12_4_ = auVar116._12_4_ * fVar210;
            auVar64._16_4_ = auVar116._16_4_ * 0.0;
            auVar64._20_4_ = auVar116._20_4_ * 0.0;
            auVar64._24_4_ = auVar116._24_4_ * 0.0;
            auVar64._28_4_ = 0;
            auVar65._4_4_ = fVar129 * -auVar196._4_4_;
            auVar65._0_4_ = fVar148 * -auVar196._0_4_;
            auVar65._8_4_ = fVar146 * -auVar196._8_4_;
            auVar65._12_4_ = fVar210 * -auVar196._12_4_;
            auVar65._16_4_ = -auVar196._16_4_ * 0.0;
            auVar65._20_4_ = -auVar196._20_4_ * 0.0;
            auVar65._24_4_ = -auVar196._24_4_ * 0.0;
            auVar65._28_4_ = auVar140._28_4_;
            auVar66._28_4_ = 0xbf000000;
            auVar66._0_28_ =
                 ZEXT1628(CONCAT412(fVar210 * 0.0,
                                    CONCAT48(fVar146 * 0.0,CONCAT44(fVar129 * 0.0,fVar148 * 0.0))));
            auVar15 = vfmadd213ps_fma(auVar60,ZEXT1632(auVar172),local_1e0);
            auVar140 = ZEXT1632(auVar172);
            auVar16 = vfmadd213ps_fma(auVar61,auVar140,_local_4a0);
            auVar108 = vfmadd213ps_fma(auVar62,auVar140,ZEXT1632(auVar14));
            auVar131 = vfnmadd213ps_fma(auVar60,auVar140,local_1e0);
            auVar107 = vfmadd213ps_fma(auVar64,ZEXT1632(auVar12),_local_480);
            auVar106 = vfnmadd213ps_fma(auVar61,auVar140,_local_4a0);
            auVar140 = ZEXT1632(auVar12);
            auVar149 = vfmadd213ps_fma(auVar65,auVar140,local_1c0);
            local_700 = ZEXT1632(auVar172);
            auVar172 = vfnmadd231ps_fma(ZEXT1632(auVar14),local_700,auVar62);
            auVar14 = vfmadd213ps_fma(auVar66,auVar140,ZEXT1632(auVar13));
            auVar132 = vfnmadd213ps_fma(auVar64,auVar140,_local_480);
            auVar162 = vfnmadd213ps_fma(auVar65,auVar140,local_1c0);
            auVar168 = vfnmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar12),auVar66);
            local_500 = ZEXT1632(auVar168);
            auVar140 = vsubps_avx(ZEXT1632(auVar149),ZEXT1632(auVar106));
            auVar196 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar172));
            auVar67._4_4_ = auVar140._4_4_ * auVar172._4_4_;
            auVar67._0_4_ = auVar140._0_4_ * auVar172._0_4_;
            auVar67._8_4_ = auVar140._8_4_ * auVar172._8_4_;
            auVar67._12_4_ = auVar140._12_4_ * auVar172._12_4_;
            auVar67._16_4_ = auVar140._16_4_ * 0.0;
            auVar67._20_4_ = auVar140._20_4_ * 0.0;
            auVar67._24_4_ = auVar140._24_4_ * 0.0;
            auVar67._28_4_ = local_1a0._28_4_;
            auVar13 = vfmsub231ps_fma(auVar67,ZEXT1632(auVar106),auVar196);
            auVar68._4_4_ = auVar131._4_4_ * auVar196._4_4_;
            auVar68._0_4_ = auVar131._0_4_ * auVar196._0_4_;
            auVar68._8_4_ = auVar131._8_4_ * auVar196._8_4_;
            auVar68._12_4_ = auVar131._12_4_ * auVar196._12_4_;
            auVar68._16_4_ = auVar196._16_4_ * 0.0;
            auVar68._20_4_ = auVar196._20_4_ * 0.0;
            auVar68._24_4_ = auVar196._24_4_ * 0.0;
            auVar68._28_4_ = auVar196._28_4_;
            auVar208 = ZEXT1632(auVar131);
            auVar196 = vsubps_avx(ZEXT1632(auVar107),auVar208);
            auVar117 = ZEXT1632(auVar172);
            auVar172 = vfmsub231ps_fma(auVar68,auVar117,auVar196);
            auVar69._4_4_ = auVar106._4_4_ * auVar196._4_4_;
            auVar69._0_4_ = auVar106._0_4_ * auVar196._0_4_;
            auVar69._8_4_ = auVar106._8_4_ * auVar196._8_4_;
            auVar69._12_4_ = auVar106._12_4_ * auVar196._12_4_;
            auVar69._16_4_ = auVar196._16_4_ * 0.0;
            auVar69._20_4_ = auVar196._20_4_ * 0.0;
            auVar69._24_4_ = auVar196._24_4_ * 0.0;
            auVar69._28_4_ = auVar196._28_4_;
            auVar131 = vfmsub231ps_fma(auVar69,auVar208,auVar140);
            auVar172 = vfmadd231ps_fma(ZEXT1632(auVar131),ZEXT832(0) << 0x20,ZEXT1632(auVar172));
            auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar110 = vcmpps_avx(ZEXT1632(auVar172),ZEXT832(0) << 0x20,2);
            local_720 = vblendvps_avx(ZEXT1632(auVar132),ZEXT1632(auVar15),auVar110);
            local_640 = vblendvps_avx(ZEXT1632(auVar162),ZEXT1632(auVar16),auVar110);
            auVar140 = vblendvps_avx(ZEXT1632(auVar168),ZEXT1632(auVar108),auVar110);
            auVar196 = vblendvps_avx(auVar208,ZEXT1632(auVar107),auVar110);
            auVar116 = vblendvps_avx(ZEXT1632(auVar106),ZEXT1632(auVar149),auVar110);
            auVar137 = vblendvps_avx(auVar117,ZEXT1632(auVar14),auVar110);
            auVar208 = vblendvps_avx(ZEXT1632(auVar107),auVar208,auVar110);
            auVar200 = vblendvps_avx(ZEXT1632(auVar149),ZEXT1632(auVar106),auVar110);
            auVar172 = vpackssdw_avx(local_220._0_16_,local_220._16_16_);
            _local_780 = ZEXT1632(auVar172);
            auVar117 = vblendvps_avx(ZEXT1632(auVar14),auVar117,auVar110);
            auVar208 = vsubps_avx(auVar208,local_720);
            auVar200 = vsubps_avx(auVar200,local_640);
            auVar17 = vsubps_avx(auVar117,auVar140);
            auVar21 = vsubps_avx(local_720,auVar196);
            auVar19 = vsubps_avx(local_640,auVar116);
            auVar20 = vsubps_avx(auVar140,auVar137);
            auVar185._0_4_ = auVar17._0_4_ * local_720._0_4_;
            auVar185._4_4_ = auVar17._4_4_ * local_720._4_4_;
            auVar185._8_4_ = auVar17._8_4_ * local_720._8_4_;
            auVar185._12_4_ = auVar17._12_4_ * local_720._12_4_;
            auVar185._16_4_ = auVar17._16_4_ * local_720._16_4_;
            auVar185._20_4_ = auVar17._20_4_ * local_720._20_4_;
            auVar185._24_4_ = auVar17._24_4_ * local_720._24_4_;
            auVar185._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar185,auVar140,auVar208);
            auVar70._4_4_ = auVar208._4_4_ * local_640._4_4_;
            auVar70._0_4_ = auVar208._0_4_ * local_640._0_4_;
            auVar70._8_4_ = auVar208._8_4_ * local_640._8_4_;
            auVar70._12_4_ = auVar208._12_4_ * local_640._12_4_;
            auVar70._16_4_ = auVar208._16_4_ * local_640._16_4_;
            auVar70._20_4_ = auVar208._20_4_ * local_640._20_4_;
            auVar70._24_4_ = auVar208._24_4_ * local_640._24_4_;
            auVar70._28_4_ = auVar117._28_4_;
            auVar14 = vfmsub231ps_fma(auVar70,local_720,auVar200);
            auVar224 = ZEXT864(0) << 0x20;
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar186._0_4_ = auVar200._0_4_ * auVar140._0_4_;
            auVar186._4_4_ = auVar200._4_4_ * auVar140._4_4_;
            auVar186._8_4_ = auVar200._8_4_ * auVar140._8_4_;
            auVar186._12_4_ = auVar200._12_4_ * auVar140._12_4_;
            auVar186._16_4_ = auVar200._16_4_ * auVar140._16_4_;
            auVar186._20_4_ = auVar200._20_4_ * auVar140._20_4_;
            auVar186._24_4_ = auVar200._24_4_ * auVar140._24_4_;
            auVar186._28_4_ = 0;
            auVar14 = vfmsub231ps_fma(auVar186,local_640,auVar17);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar187._0_4_ = auVar20._0_4_ * auVar196._0_4_;
            auVar187._4_4_ = auVar20._4_4_ * auVar196._4_4_;
            auVar187._8_4_ = auVar20._8_4_ * auVar196._8_4_;
            auVar187._12_4_ = auVar20._12_4_ * auVar196._12_4_;
            auVar187._16_4_ = auVar20._16_4_ * auVar196._16_4_;
            auVar187._20_4_ = auVar20._20_4_ * auVar196._20_4_;
            auVar187._24_4_ = auVar20._24_4_ * auVar196._24_4_;
            auVar187._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar187,auVar21,auVar137);
            auVar71._4_4_ = auVar19._4_4_ * auVar137._4_4_;
            auVar71._0_4_ = auVar19._0_4_ * auVar137._0_4_;
            auVar71._8_4_ = auVar19._8_4_ * auVar137._8_4_;
            auVar71._12_4_ = auVar19._12_4_ * auVar137._12_4_;
            auVar71._16_4_ = auVar19._16_4_ * auVar137._16_4_;
            auVar71._20_4_ = auVar19._20_4_ * auVar137._20_4_;
            auVar71._24_4_ = auVar19._24_4_ * auVar137._24_4_;
            auVar71._28_4_ = auVar137._28_4_;
            auVar15 = vfmsub231ps_fma(auVar71,auVar116,auVar20);
            auVar72._4_4_ = auVar21._4_4_ * auVar116._4_4_;
            auVar72._0_4_ = auVar21._0_4_ * auVar116._0_4_;
            auVar72._8_4_ = auVar21._8_4_ * auVar116._8_4_;
            auVar72._12_4_ = auVar21._12_4_ * auVar116._12_4_;
            auVar72._16_4_ = auVar21._16_4_ * auVar116._16_4_;
            auVar72._20_4_ = auVar21._20_4_ * auVar116._20_4_;
            auVar72._24_4_ = auVar21._24_4_ * auVar116._24_4_;
            auVar72._28_4_ = auVar116._28_4_;
            auVar16 = vfmsub231ps_fma(auVar72,auVar19,auVar196);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar196 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
            auVar196 = vcmpps_avx(auVar196,ZEXT832(0) << 0x20,2);
            auVar13 = vpackssdw_avx(auVar196._0_16_,auVar196._16_16_);
            auVar172 = vpand_avx(auVar13,auVar172);
            auVar196 = vpmovsxwd_avx2(auVar172);
            if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar196 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar196 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar196 >> 0x7f,0) == '\0') &&
                  (auVar196 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar196 >> 0xbf,0) == '\0') &&
                (auVar196 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar196[0x1f]) {
LAB_0166f284:
              auVar165 = ZEXT3264(CONCAT824(local_460[1]._24_8_,
                                            CONCAT816(local_460[1]._16_8_,
                                                      CONCAT88(local_460[1]._8_8_,local_460[1]._0_8_
                                                              ))));
            }
            else {
              auVar73._4_4_ = auVar200._4_4_ * auVar20._4_4_;
              auVar73._0_4_ = auVar200._0_4_ * auVar20._0_4_;
              auVar73._8_4_ = auVar200._8_4_ * auVar20._8_4_;
              auVar73._12_4_ = auVar200._12_4_ * auVar20._12_4_;
              auVar73._16_4_ = auVar200._16_4_ * auVar20._16_4_;
              auVar73._20_4_ = auVar200._20_4_ * auVar20._20_4_;
              auVar73._24_4_ = auVar200._24_4_ * auVar20._24_4_;
              auVar73._28_4_ = auVar196._28_4_;
              auVar107 = vfmsub231ps_fma(auVar73,auVar19,auVar17);
              auVar191._0_4_ = auVar21._0_4_ * auVar17._0_4_;
              auVar191._4_4_ = auVar21._4_4_ * auVar17._4_4_;
              auVar191._8_4_ = auVar21._8_4_ * auVar17._8_4_;
              auVar191._12_4_ = auVar21._12_4_ * auVar17._12_4_;
              auVar191._16_4_ = auVar21._16_4_ * auVar17._16_4_;
              auVar191._20_4_ = auVar21._20_4_ * auVar17._20_4_;
              auVar191._24_4_ = auVar21._24_4_ * auVar17._24_4_;
              auVar191._28_4_ = 0;
              auVar108 = vfmsub231ps_fma(auVar191,auVar208,auVar20);
              auVar74._4_4_ = auVar208._4_4_ * auVar19._4_4_;
              auVar74._0_4_ = auVar208._0_4_ * auVar19._0_4_;
              auVar74._8_4_ = auVar208._8_4_ * auVar19._8_4_;
              auVar74._12_4_ = auVar208._12_4_ * auVar19._12_4_;
              auVar74._16_4_ = auVar208._16_4_ * auVar19._16_4_;
              auVar74._20_4_ = auVar208._20_4_ * auVar19._20_4_;
              auVar74._24_4_ = auVar208._24_4_ * auVar19._24_4_;
              auVar74._28_4_ = auVar19._28_4_;
              auVar149 = vfmsub231ps_fma(auVar74,auVar21,auVar200);
              auVar13 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar108),ZEXT1632(auVar149));
              auVar16 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar107),ZEXT832(0) << 0x20);
              auVar196 = vrcpps_avx(ZEXT1632(auVar16));
              auVar223._8_4_ = 0x3f800000;
              auVar223._0_8_ = &DAT_3f8000003f800000;
              auVar223._12_4_ = 0x3f800000;
              auVar223._16_4_ = 0x3f800000;
              auVar223._20_4_ = 0x3f800000;
              auVar223._24_4_ = 0x3f800000;
              auVar223._28_4_ = 0x3f800000;
              auVar224 = ZEXT3264(auVar223);
              auVar13 = vfnmadd213ps_fma(auVar196,ZEXT1632(auVar16),auVar223);
              auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar196,auVar196);
              auVar75._4_4_ = auVar149._4_4_ * auVar140._4_4_;
              auVar75._0_4_ = auVar149._0_4_ * auVar140._0_4_;
              auVar75._8_4_ = auVar149._8_4_ * auVar140._8_4_;
              auVar75._12_4_ = auVar149._12_4_ * auVar140._12_4_;
              auVar75._16_4_ = auVar140._16_4_ * 0.0;
              auVar75._20_4_ = auVar140._20_4_ * 0.0;
              auVar75._24_4_ = auVar140._24_4_ * 0.0;
              auVar75._28_4_ = auVar140._28_4_;
              auVar108 = vfmadd231ps_fma(auVar75,ZEXT1632(auVar108),local_640);
              auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),ZEXT1632(auVar107),local_720);
              fVar129 = auVar13._0_4_;
              fVar146 = auVar13._4_4_;
              fVar210 = auVar13._8_4_;
              fVar211 = auVar13._12_4_;
              auVar116 = ZEXT1632(CONCAT412(fVar211 * auVar108._12_4_,
                                            CONCAT48(fVar210 * auVar108._8_4_,
                                                     CONCAT44(fVar146 * auVar108._4_4_,
                                                              fVar129 * auVar108._0_4_))));
              fVar148 = (ray->super_RayK<1>).tfar;
              auVar164._4_4_ = fVar148;
              auVar164._0_4_ = fVar148;
              auVar164._8_4_ = fVar148;
              auVar164._12_4_ = fVar148;
              auVar164._16_4_ = fVar148;
              auVar164._20_4_ = fVar148;
              auVar164._24_4_ = fVar148;
              auVar164._28_4_ = fVar148;
              auVar90._4_4_ = uStack_15c;
              auVar90._0_4_ = local_160;
              auVar90._8_4_ = uStack_158;
              auVar90._12_4_ = uStack_154;
              auVar90._16_4_ = uStack_150;
              auVar90._20_4_ = uStack_14c;
              auVar90._24_4_ = uStack_148;
              auVar90._28_4_ = uStack_144;
              auVar140 = vcmpps_avx(auVar90,auVar116,2);
              auVar196 = vcmpps_avx(auVar116,auVar164,2);
              auVar140 = vandps_avx(auVar196,auVar140);
              auVar13 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
              auVar172 = vpand_avx(auVar172,auVar13);
              auVar140 = vpmovsxwd_avx2(auVar172);
              if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar140 >> 0x7f,0) == '\0') &&
                    (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar140 >> 0xbf,0) == '\0') &&
                  (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar140[0x1f]) goto LAB_0166f284;
              auVar140 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,4);
              auVar13 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
              auVar172 = vpand_avx(auVar172,auVar13);
              auVar140 = vpmovsxwd_avx2(auVar172);
              auVar165 = ZEXT3264(CONCAT824(local_460[1]._24_8_,
                                            CONCAT816(local_460[1]._16_8_,
                                                      CONCAT88(local_460[1]._8_8_,local_460[1]._0_8_
                                                              ))));
              if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar140 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar140 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar140 >> 0x7f,0) != '\0') ||
                    (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar140 >> 0xbf,0) != '\0') ||
                  (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar140[0x1f] < '\0') {
                auVar137 = ZEXT1632(CONCAT412(fVar211 * auVar14._12_4_,
                                              CONCAT48(fVar210 * auVar14._8_4_,
                                                       CONCAT44(fVar146 * auVar14._4_4_,
                                                                fVar129 * auVar14._0_4_))));
                auVar76._28_4_ = SUB84(local_460[1]._24_8_,4);
                auVar76._0_28_ =
                     ZEXT1628(CONCAT412(fVar211 * auVar15._12_4_,
                                        CONCAT48(fVar210 * auVar15._8_4_,
                                                 CONCAT44(fVar146 * auVar15._4_4_,
                                                          fVar129 * auVar15._0_4_))));
                auVar220._8_4_ = 0x3f800000;
                auVar220._0_8_ = &DAT_3f8000003f800000;
                auVar220._12_4_ = 0x3f800000;
                auVar220._16_4_ = 0x3f800000;
                auVar220._20_4_ = 0x3f800000;
                auVar220._24_4_ = 0x3f800000;
                auVar220._28_4_ = 0x3f800000;
                auVar196 = vsubps_avx(auVar220,auVar137);
                local_120 = vblendvps_avx(auVar196,auVar137,auVar110);
                auVar196 = vsubps_avx(auVar220,auVar76);
                local_260 = vblendvps_avx(auVar196,auVar76,auVar110);
                auVar165 = ZEXT3264(auVar140);
                local_3e0 = auVar116;
              }
            }
            auVar215 = ZEXT3264(local_660);
            auVar209 = ZEXT3264(local_6a0);
            auVar202 = ZEXT3264(local_680);
            auVar140 = auVar165._0_32_;
            if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar140 >> 0x7f,0) == '\0') &&
                  (auVar165 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar140 >> 0xbf,0) == '\0') &&
                (auVar165 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar165[0x1f]) goto LAB_0166ef71;
            auVar196 = vsubps_avx(ZEXT1632(auVar12),local_700);
            auVar172 = vfmadd213ps_fma(auVar196,local_120,local_700);
            fVar148 = pre->depth_scale;
            auVar77._4_4_ = (auVar172._4_4_ + auVar172._4_4_) * fVar148;
            auVar77._0_4_ = (auVar172._0_4_ + auVar172._0_4_) * fVar148;
            auVar77._8_4_ = (auVar172._8_4_ + auVar172._8_4_) * fVar148;
            auVar77._12_4_ = (auVar172._12_4_ + auVar172._12_4_) * fVar148;
            auVar77._16_4_ = fVar148 * 0.0;
            auVar77._20_4_ = fVar148 * 0.0;
            auVar77._24_4_ = fVar148 * 0.0;
            auVar77._28_4_ = fVar148;
            auVar196 = vcmpps_avx(local_3e0,auVar77,6);
            auVar116 = auVar140 & auVar196;
            auVar197 = ZEXT3264(local_600);
            auVar192 = ZEXT3264(local_5e0);
            if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar116 >> 0x7f,0) == '\0') &&
                  (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar116 >> 0xbf,0) == '\0') &&
                (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar116[0x1f]) {
              auVar145 = ZEXT3264(local_4e0);
            }
            else {
              auVar140 = vandps_avx(auVar196,auVar140);
              auVar141._8_4_ = 0xbf800000;
              auVar141._0_8_ = 0xbf800000bf800000;
              auVar141._12_4_ = 0xbf800000;
              auVar141._16_4_ = 0xbf800000;
              auVar141._20_4_ = 0xbf800000;
              auVar141._24_4_ = 0xbf800000;
              auVar141._28_4_ = 0xbf800000;
              auVar160._8_4_ = 0x40000000;
              auVar160._0_8_ = 0x4000000040000000;
              auVar160._12_4_ = 0x40000000;
              auVar160._16_4_ = 0x40000000;
              auVar160._20_4_ = 0x40000000;
              auVar160._24_4_ = 0x40000000;
              auVar160._28_4_ = 0x40000000;
              auVar172 = vfmadd213ps_fma(local_260,auVar160,auVar141);
              auVar165 = ZEXT1664(auVar172);
              local_3a0 = local_120;
              local_260 = ZEXT1632(auVar172);
              auVar196 = local_260;
              local_380 = ZEXT1632(auVar172);
              local_360 = local_3e0;
              local_33c = iVar9;
              local_330 = local_6e0;
              uStack_328 = uStack_6d8;
              local_320 = local_560._0_8_;
              uStack_318 = local_560._8_8_;
              local_310 = local_570._0_8_;
              uStack_308 = local_570._8_8_;
              local_300 = local_580;
              uStack_2f8 = uStack_578;
              local_2e0 = auVar140;
              pGVar10 = (context->scene->geometries).items[local_728].ptr;
              if ((pGVar10->mask & (ray->super_RayK<1>).mask) != 0) {
                local_460[0] = auVar140;
                auVar224 = ZEXT1264(ZEXT812(0));
                fVar148 = (float)local_340;
                local_2c0[0] = (fVar148 + local_120._0_4_ + 0.0) * (float)local_3c0._0_4_;
                local_2c0[1] = (fVar148 + local_120._4_4_ + 1.0) * (float)local_3c0._4_4_;
                local_2c0[2] = (fVar148 + local_120._8_4_ + 2.0) * fStack_3b8;
                local_2c0[3] = (fVar148 + local_120._12_4_ + 3.0) * fStack_3b4;
                fStack_2b0 = (fVar148 + local_120._16_4_ + 4.0) * fStack_3b0;
                fStack_2ac = (fVar148 + local_120._20_4_ + 5.0) * fStack_3ac;
                fStack_2a8 = (fVar148 + local_120._24_4_ + 6.0) * fStack_3a8;
                fStack_2a4 = fVar148 + local_120._28_4_ + 7.0;
                local_260._0_8_ = auVar172._0_8_;
                local_260._8_8_ = auVar172._8_8_;
                local_2a0 = local_260._0_8_;
                uStack_298 = local_260._8_8_;
                uStack_290 = 0;
                uStack_288 = 0;
                local_280 = local_3e0;
                auVar142._8_4_ = 0x7f800000;
                auVar142._0_8_ = 0x7f8000007f800000;
                auVar142._12_4_ = 0x7f800000;
                auVar142._16_4_ = 0x7f800000;
                auVar142._20_4_ = 0x7f800000;
                auVar142._24_4_ = 0x7f800000;
                auVar142._28_4_ = 0x7f800000;
                auVar116 = vblendvps_avx(auVar142,local_3e0,auVar140);
                auVar137 = vshufps_avx(auVar116,auVar116,0xb1);
                auVar137 = vminps_avx(auVar116,auVar137);
                auVar208 = vshufpd_avx(auVar137,auVar137,5);
                auVar137 = vminps_avx(auVar137,auVar208);
                auVar208 = vpermpd_avx2(auVar137,0x4e);
                auVar137 = vminps_avx(auVar137,auVar208);
                auVar116 = vcmpps_avx(auVar116,auVar137,0);
                auVar137 = auVar140 & auVar116;
                if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar137 >> 0x7f,0) != '\0') ||
                      (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar137 >> 0xbf,0) != '\0') ||
                    (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar137[0x1f] < '\0') {
                  auVar140 = vandps_avx(auVar116,auVar140);
                }
                uVar94 = vmovmskps_avx(auVar140);
                uVar8 = 0;
                for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                  uVar8 = uVar8 + 1;
                }
                uVar95 = (ulong)uVar8;
                local_260 = auVar196;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar148 = local_2c0[uVar95];
                  fVar129 = *(float *)((long)&local_2a0 + uVar95 * 4);
                  fVar146 = 1.0 - fVar148;
                  auVar172 = ZEXT416((uint)(fVar148 * fVar146 * 4.0));
                  auVar12 = vfnmsub213ss_fma(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148),auVar172)
                  ;
                  auVar172 = vfmadd213ss_fma(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),auVar172)
                  ;
                  fVar146 = fVar146 * -fVar146 * 0.5;
                  fVar210 = auVar12._0_4_ * 0.5;
                  fVar211 = auVar172._0_4_ * 0.5;
                  fVar212 = fVar148 * fVar148 * 0.5;
                  auVar173._0_4_ = fVar212 * (float)local_580._0_4_;
                  auVar173._4_4_ = fVar212 * (float)local_580._4_4_;
                  auVar173._8_4_ = fVar212 * (float)uStack_578;
                  auVar173._12_4_ = fVar212 * uStack_578._4_4_;
                  auVar152._4_4_ = fVar211;
                  auVar152._0_4_ = fVar211;
                  auVar152._8_4_ = fVar211;
                  auVar152._12_4_ = fVar211;
                  auVar172 = vfmadd132ps_fma(auVar152,auVar173,local_570);
                  auVar174._4_4_ = fVar210;
                  auVar174._0_4_ = fVar210;
                  auVar174._8_4_ = fVar210;
                  auVar174._12_4_ = fVar210;
                  auVar172 = vfmadd132ps_fma(auVar174,auVar172,local_560);
                  auVar153._4_4_ = fVar146;
                  auVar153._0_4_ = fVar146;
                  auVar153._8_4_ = fVar146;
                  auVar153._12_4_ = fVar146;
                  auVar87._8_8_ = uStack_6d8;
                  auVar87._0_8_ = local_6e0;
                  auVar172 = vfmadd132ps_fma(auVar153,auVar172,auVar87);
                  auVar165 = ZEXT464((uint)*(float *)(local_280 + uVar95 * 4));
                  (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar95 * 4);
                  uVar104 = vmovlps_avx(auVar172);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar104;
                  fVar146 = (float)vextractps_avx(auVar172,2);
                  (ray->Ng).field_0.field_0.z = fVar146;
                  ray->u = fVar148;
                  ray->v = fVar129;
                  ray->primID = uVar96;
                  ray->geomID = (uint)local_728;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_720._0_8_ = pGVar10;
                  local_640._0_16_ = local_560;
                  local_500 = ZEXT1632(local_570);
                  _local_4a0 = ZEXT1632(_local_580);
                  local_730 = pPVar99;
                  local_738 = context;
                  local_740 = ray;
                  local_748 = pre;
                  do {
                    local_544 = local_2c0[uVar95];
                    local_540 = *(undefined4 *)((long)&local_2a0 + uVar95 * 4);
                    local_780._0_4_ = (ray->super_RayK<1>).tfar;
                    local_700._0_8_ = uVar95;
                    (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar95 * 4);
                    local_6d0.context = context->user;
                    fVar148 = 1.0 - local_544;
                    auVar172 = ZEXT416((uint)(local_544 * fVar148 * 4.0));
                    auVar12 = vfnmsub213ss_fma(ZEXT416((uint)local_544),ZEXT416((uint)local_544),
                                               auVar172);
                    auVar172 = vfmadd213ss_fma(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148),
                                               auVar172);
                    fVar148 = fVar148 * -fVar148 * 0.5;
                    fVar129 = auVar12._0_4_ * 0.5;
                    fVar146 = auVar172._0_4_ * 0.5;
                    fVar210 = local_544 * local_544 * 0.5;
                    auVar175._0_4_ = fVar210 * (float)local_4a0._0_4_;
                    auVar175._4_4_ = fVar210 * (float)local_4a0._4_4_;
                    auVar175._8_4_ = fVar210 * fStack_498;
                    auVar175._12_4_ = fVar210 * fStack_494;
                    auVar154._4_4_ = fVar146;
                    auVar154._0_4_ = fVar146;
                    auVar154._8_4_ = fVar146;
                    auVar154._12_4_ = fVar146;
                    auVar172 = vfmadd132ps_fma(auVar154,auVar175,local_500._0_16_);
                    auVar176._4_4_ = fVar129;
                    auVar176._0_4_ = fVar129;
                    auVar176._8_4_ = fVar129;
                    auVar176._12_4_ = fVar129;
                    auVar172 = vfmadd132ps_fma(auVar176,auVar172,local_640._0_16_);
                    auVar155._4_4_ = fVar148;
                    auVar155._0_4_ = fVar148;
                    auVar155._8_4_ = fVar148;
                    auVar155._12_4_ = fVar148;
                    auVar88._8_8_ = uStack_6d8;
                    auVar88._0_8_ = local_6e0;
                    auVar172 = vfmadd132ps_fma(auVar155,auVar172,auVar88);
                    local_550 = vmovlps_avx(auVar172);
                    local_548 = vextractps_avx(auVar172,2);
                    local_53c = uVar96;
                    local_538 = (int)local_728;
                    local_534 = (local_6d0.context)->instID[0];
                    local_530 = (local_6d0.context)->instPrimID[0];
                    local_784 = -1;
                    local_6d0.valid = &local_784;
                    local_6d0.geometryUserPtr = *(void **)(local_720._0_8_ + 0x18);
                    local_6d0.ray = (RTCRayN *)ray;
                    local_6d0.hit = (RTCHitN *)&local_550;
                    local_6d0.N = 1;
                    if (*(code **)(local_720._0_8_ + 0x40) == (code *)0x0) {
LAB_0166f4fb:
                      p_Var11 = context->args->filter;
                      if (p_Var11 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           ((*(byte *)(local_720._0_8_ + 0x3e) & 0x40) != 0)) {
                          auVar224 = ZEXT1664(auVar224._0_16_);
                          (*p_Var11)(&local_6d0);
                        }
                        auVar215 = ZEXT3264(local_660);
                        auVar209 = ZEXT3264(local_6a0);
                        auVar202 = ZEXT3264(local_680);
                        auVar197 = ZEXT3264(local_600);
                        pre = local_748;
                        pPVar99 = local_730;
                        context = local_738;
                        ray = local_740;
                        fVar147 = local_5a0;
                        fVar103 = fStack_59c;
                        fVar121 = fStack_598;
                        fVar123 = fStack_594;
                        fVar125 = fStack_590;
                        fVar126 = fStack_58c;
                        fVar127 = fStack_588;
                        fVar128 = fStack_584;
                        fVar161 = (float)local_620;
                        fVar166 = local_620._4_4_;
                        fVar120 = (float)uStack_618;
                        fVar122 = uStack_618._4_4_;
                        fVar124 = (float)uStack_610;
                        fVar229 = uStack_610._4_4_;
                        fVar230 = (float)uStack_608;
                        if (*local_6d0.valid == 0) goto LAB_0166f5ec;
                      }
                      (((Vec3f *)((long)local_6d0.ray + 0x30))->field_0).components[0] =
                           *(float *)local_6d0.hit;
                      (((Vec3f *)((long)local_6d0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_6d0.hit + 4);
                      (((Vec3f *)((long)local_6d0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_6d0.hit + 8);
                      *(float *)((long)local_6d0.ray + 0x3c) = *(float *)(local_6d0.hit + 0xc);
                      *(float *)((long)local_6d0.ray + 0x40) = *(float *)(local_6d0.hit + 0x10);
                      *(float *)((long)local_6d0.ray + 0x44) = *(float *)(local_6d0.hit + 0x14);
                      *(float *)((long)local_6d0.ray + 0x48) = *(float *)(local_6d0.hit + 0x18);
                      *(float *)((long)local_6d0.ray + 0x4c) = *(float *)(local_6d0.hit + 0x1c);
                      *(float *)((long)local_6d0.ray + 0x50) = *(float *)(local_6d0.hit + 0x20);
                    }
                    else {
                      auVar224 = ZEXT1664(auVar224._0_16_);
                      (**(code **)(local_720._0_8_ + 0x40))(&local_6d0);
                      auVar197 = ZEXT3264(local_600);
                      auVar202 = ZEXT3264(local_680);
                      auVar209 = ZEXT3264(local_6a0);
                      auVar215 = ZEXT3264(local_660);
                      pre = local_748;
                      pPVar99 = local_730;
                      context = local_738;
                      ray = local_740;
                      fVar147 = local_5a0;
                      fVar103 = fStack_59c;
                      fVar121 = fStack_598;
                      fVar123 = fStack_594;
                      fVar125 = fStack_590;
                      fVar126 = fStack_58c;
                      fVar127 = fStack_588;
                      fVar128 = fStack_584;
                      fVar161 = (float)local_620;
                      fVar166 = local_620._4_4_;
                      fVar120 = (float)uStack_618;
                      fVar122 = uStack_618._4_4_;
                      fVar124 = (float)uStack_610;
                      fVar229 = uStack_610._4_4_;
                      fVar230 = (float)uStack_608;
                      if (*local_6d0.valid != 0) goto LAB_0166f4fb;
LAB_0166f5ec:
                      (local_740->super_RayK<1>).tfar = (float)local_780._0_4_;
                      pre = local_748;
                      pPVar99 = local_730;
                      context = local_738;
                      ray = local_740;
                      fVar147 = local_5a0;
                      fVar103 = fStack_59c;
                      fVar121 = fStack_598;
                      fVar123 = fStack_594;
                      fVar125 = fStack_590;
                      fVar126 = fStack_58c;
                      fVar127 = fStack_588;
                      fVar128 = fStack_584;
                    }
                    auVar137 = local_3e0;
                    *(undefined4 *)(local_460[0] + local_700._0_8_ * 4) = 0;
                    auVar116 = local_460[0];
                    fVar148 = (ray->super_RayK<1>).tfar;
                    auVar118._4_4_ = fVar148;
                    auVar118._0_4_ = fVar148;
                    auVar118._8_4_ = fVar148;
                    auVar118._12_4_ = fVar148;
                    auVar118._16_4_ = fVar148;
                    auVar118._20_4_ = fVar148;
                    auVar118._24_4_ = fVar148;
                    auVar118._28_4_ = fVar148;
                    auVar196 = vcmpps_avx(auVar137,auVar118,2);
                    auVar140 = vandps_avx(auVar196,local_460[0]);
                    local_460[0] = auVar140;
                    auVar116 = auVar116 & auVar196;
                    bVar85 = (auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar86 = (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar84 = (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar83 = SUB321(auVar116 >> 0x7f,0) != '\0';
                    bVar82 = (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar81 = SUB321(auVar116 >> 0xbf,0) != '\0';
                    bVar79 = (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar78 = auVar116[0x1f] < '\0';
                    uVar95 = local_700._0_8_;
                    if (((((((bVar85 || bVar86) || bVar84) || bVar83) || bVar82) || bVar81) ||
                        bVar79) || bVar78) {
                      auVar143._8_4_ = 0x7f800000;
                      auVar143._0_8_ = 0x7f8000007f800000;
                      auVar143._12_4_ = 0x7f800000;
                      auVar143._16_4_ = 0x7f800000;
                      auVar143._20_4_ = 0x7f800000;
                      auVar143._24_4_ = 0x7f800000;
                      auVar143._28_4_ = 0x7f800000;
                      auVar196 = vblendvps_avx(auVar143,auVar137,auVar140);
                      auVar116 = vshufps_avx(auVar196,auVar196,0xb1);
                      auVar116 = vminps_avx(auVar196,auVar116);
                      auVar137 = vshufpd_avx(auVar116,auVar116,5);
                      auVar116 = vminps_avx(auVar116,auVar137);
                      auVar137 = vpermpd_avx2(auVar116,0x4e);
                      auVar116 = vminps_avx(auVar116,auVar137);
                      auVar196 = vcmpps_avx(auVar196,auVar116,0);
                      auVar116 = auVar140 & auVar196;
                      if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar116 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar116 >> 0x7f,0) != '\0') ||
                            (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar116 >> 0xbf,0) != '\0') ||
                          (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar116[0x1f] < '\0') {
                        auVar140 = vandps_avx(auVar196,auVar140);
                      }
                      uVar94 = vmovmskps_avx(auVar140);
                      uVar8 = 0;
                      for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                        uVar8 = uVar8 + 1;
                      }
                      uVar95 = (ulong)uVar8;
                    }
                    auVar165 = ZEXT3264(auVar137);
                  } while (((((((bVar85 || bVar86) || bVar84) || bVar83) || bVar82) || bVar81) ||
                           bVar79) || bVar78);
                }
                auVar192 = ZEXT3264(local_5e0);
              }
              auVar145 = ZEXT3264(local_4e0);
            }
          }
          lVar101 = lVar101 + 8;
        } while ((int)lVar101 < iVar9);
      }
      fVar147 = (ray->super_RayK<1>).tfar;
      auVar109._4_4_ = fVar147;
      auVar109._0_4_ = fVar147;
      auVar109._8_4_ = fVar147;
      auVar109._12_4_ = fVar147;
      auVar172 = vcmpps_avx(local_180,auVar109,2);
      uVar96 = vmovmskps_avx(auVar172);
      uVar96 = (uint)uVar100 & uVar96;
    } while (uVar96 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }